

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined8 uVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  byte bVar95;
  byte bVar96;
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  long lVar100;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar101;
  long lVar102;
  byte bVar103;
  float fVar104;
  float fVar105;
  float fVar153;
  float fVar154;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar110 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar156;
  float fVar159;
  float fVar160;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar161;
  undefined4 uVar162;
  undefined8 uVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar193;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar194;
  float fVar201;
  float fVar202;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined4 uVar226;
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_780;
  undefined8 uStack_778;
  RTCFilterFunctionNArguments local_768;
  undefined1 (*local_738) [32];
  undefined1 local_730 [16];
  uint local_720;
  undefined4 uStack_71c;
  undefined8 uStack_718;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined8 uStack_618;
  LinearSpace3fa *local_608;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  int local_43c;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  byte local_3f0;
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int iStack_27c;
  int iStack_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int iStack_268;
  int iStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar13 = prim[1];
  uVar97 = (ulong)(byte)PVar13;
  lVar32 = uVar97 * 0x25;
  fVar194 = *(float *)(prim + lVar32 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar164 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar108 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + lVar32 + 6));
  fVar185 = fVar194 * auVar108._0_4_;
  fVar161 = fVar194 * auVar164._0_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar114 = vpmovsxbd_avx2(auVar107);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar126 = vpmovsxbd_avx2(auVar236);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar97 * 0xf + 6);
  auVar125 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar119 = vpmovsxbd_avx2(auVar8);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar116 = vcvtdq2ps_avx(auVar119);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar97 + 6);
  auVar117 = vpmovsxbd_avx2(auVar9);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x1a + 6);
  auVar124 = vpmovsxbd_avx2(auVar10);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar97 * 0x1b + 6);
  auVar118 = vpmovsxbd_avx2(auVar11);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar97 * 0x1c + 6);
  auVar113 = vpmovsxbd_avx2(auVar12);
  auVar120 = vcvtdq2ps_avx(auVar113);
  auVar207._4_4_ = fVar161;
  auVar207._0_4_ = fVar161;
  auVar207._8_4_ = fVar161;
  auVar207._12_4_ = fVar161;
  auVar207._16_4_ = fVar161;
  auVar207._20_4_ = fVar161;
  auVar207._24_4_ = fVar161;
  auVar207._28_4_ = fVar161;
  auVar230._8_4_ = 1;
  auVar230._0_8_ = 0x100000001;
  auVar230._12_4_ = 1;
  auVar230._16_4_ = 1;
  auVar230._20_4_ = 1;
  auVar230._24_4_ = 1;
  auVar230._28_4_ = 1;
  auVar111 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar122 = ZEXT1632(CONCAT412(fVar194 * auVar164._12_4_,
                                CONCAT48(fVar194 * auVar164._8_4_,
                                         CONCAT44(fVar194 * auVar164._4_4_,fVar161))));
  auVar121 = vpermps_avx2(auVar230,auVar122);
  auVar112 = vpermps_avx512vl(auVar111,auVar122);
  fVar201 = auVar112._0_4_;
  fVar202 = auVar112._4_4_;
  auVar122._4_4_ = fVar202 * auVar126._4_4_;
  auVar122._0_4_ = fVar201 * auVar126._0_4_;
  fVar186 = auVar112._8_4_;
  auVar122._8_4_ = fVar186 * auVar126._8_4_;
  fVar193 = auVar112._12_4_;
  auVar122._12_4_ = fVar193 * auVar126._12_4_;
  fVar104 = auVar112._16_4_;
  auVar122._16_4_ = fVar104 * auVar126._16_4_;
  fVar105 = auVar112._20_4_;
  auVar122._20_4_ = fVar105 * auVar126._20_4_;
  fVar153 = auVar112._24_4_;
  auVar122._24_4_ = fVar153 * auVar126._24_4_;
  auVar122._28_4_ = auVar119._28_4_;
  auVar119._4_4_ = auVar117._4_4_ * fVar202;
  auVar119._0_4_ = auVar117._0_4_ * fVar201;
  auVar119._8_4_ = auVar117._8_4_ * fVar186;
  auVar119._12_4_ = auVar117._12_4_ * fVar193;
  auVar119._16_4_ = auVar117._16_4_ * fVar104;
  auVar119._20_4_ = auVar117._20_4_ * fVar105;
  auVar119._24_4_ = auVar117._24_4_ * fVar153;
  auVar119._28_4_ = auVar113._28_4_;
  auVar113._4_4_ = auVar120._4_4_ * fVar202;
  auVar113._0_4_ = auVar120._0_4_ * fVar201;
  auVar113._8_4_ = auVar120._8_4_ * fVar186;
  auVar113._12_4_ = auVar120._12_4_ * fVar193;
  auVar113._16_4_ = auVar120._16_4_ * fVar104;
  auVar113._20_4_ = auVar120._20_4_ * fVar105;
  auVar113._24_4_ = auVar120._24_4_ * fVar153;
  auVar113._28_4_ = auVar112._28_4_;
  auVar106 = vfmadd231ps_fma(auVar122,auVar121,auVar114);
  auVar107 = vfmadd231ps_fma(auVar119,auVar121,auVar116);
  auVar236 = vfmadd231ps_fma(auVar113,auVar118,auVar121);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar207,auVar115);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar207,auVar125);
  auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar124,auVar207);
  auVar227._4_4_ = fVar185;
  auVar227._0_4_ = fVar185;
  auVar227._8_4_ = fVar185;
  auVar227._12_4_ = fVar185;
  auVar227._16_4_ = fVar185;
  auVar227._20_4_ = fVar185;
  auVar227._24_4_ = fVar185;
  auVar227._28_4_ = fVar185;
  auVar113 = ZEXT1632(CONCAT412(fVar194 * auVar108._12_4_,
                                CONCAT48(fVar194 * auVar108._8_4_,
                                         CONCAT44(fVar194 * auVar108._4_4_,fVar185))));
  auVar119 = vpermps_avx2(auVar230,auVar113);
  auVar113 = vpermps_avx512vl(auVar111,auVar113);
  fVar194 = auVar113._0_4_;
  fVar201 = auVar113._4_4_;
  auVar121._4_4_ = fVar201 * auVar126._4_4_;
  auVar121._0_4_ = fVar194 * auVar126._0_4_;
  fVar202 = auVar113._8_4_;
  auVar121._8_4_ = fVar202 * auVar126._8_4_;
  fVar186 = auVar113._12_4_;
  auVar121._12_4_ = fVar186 * auVar126._12_4_;
  fVar193 = auVar113._16_4_;
  auVar121._16_4_ = fVar193 * auVar126._16_4_;
  fVar104 = auVar113._20_4_;
  auVar121._20_4_ = fVar104 * auVar126._20_4_;
  fVar105 = auVar113._24_4_;
  auVar121._24_4_ = fVar105 * auVar126._24_4_;
  auVar121._28_4_ = fVar161;
  auVar111._4_4_ = auVar117._4_4_ * fVar201;
  auVar111._0_4_ = auVar117._0_4_ * fVar194;
  auVar111._8_4_ = auVar117._8_4_ * fVar202;
  auVar111._12_4_ = auVar117._12_4_ * fVar186;
  auVar111._16_4_ = auVar117._16_4_ * fVar193;
  auVar111._20_4_ = auVar117._20_4_ * fVar104;
  auVar111._24_4_ = auVar117._24_4_ * fVar105;
  auVar111._28_4_ = auVar126._28_4_;
  auVar117._4_4_ = auVar120._4_4_ * fVar201;
  auVar117._0_4_ = auVar120._0_4_ * fVar194;
  auVar117._8_4_ = auVar120._8_4_ * fVar202;
  auVar117._12_4_ = auVar120._12_4_ * fVar186;
  auVar117._16_4_ = auVar120._16_4_ * fVar193;
  auVar117._20_4_ = auVar120._20_4_ * fVar104;
  auVar117._24_4_ = auVar120._24_4_ * fVar105;
  auVar117._28_4_ = auVar113._28_4_;
  auVar7 = vfmadd231ps_fma(auVar121,auVar119,auVar114);
  auVar8 = vfmadd231ps_fma(auVar111,auVar119,auVar116);
  auVar9 = vfmadd231ps_fma(auVar117,auVar119,auVar118);
  auVar164 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar227,auVar115);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar227,auVar125);
  auVar217._8_4_ = 0x7fffffff;
  auVar217._0_8_ = 0x7fffffff7fffffff;
  auVar217._12_4_ = 0x7fffffff;
  auVar217._16_4_ = 0x7fffffff;
  auVar217._20_4_ = 0x7fffffff;
  auVar217._24_4_ = 0x7fffffff;
  auVar217._28_4_ = 0x7fffffff;
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar227,auVar124);
  auVar115 = vandps_avx(auVar217,ZEXT1632(auVar106));
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar213._16_4_ = 0x219392ef;
  auVar213._20_4_ = 0x219392ef;
  auVar213._24_4_ = 0x219392ef;
  auVar213._28_4_ = 0x219392ef;
  uVar99 = vcmpps_avx512vl(auVar115,auVar213,1);
  bVar22 = (bool)((byte)uVar99 & 1);
  auVar112._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar106._0_4_;
  bVar22 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar106._4_4_;
  bVar22 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar106._8_4_;
  bVar22 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar106._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(auVar217,ZEXT1632(auVar107));
  uVar99 = vcmpps_avx512vl(auVar115,auVar213,1);
  bVar22 = (bool)((byte)uVar99 & 1);
  auVar123._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar107._0_4_;
  bVar22 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar107._4_4_;
  bVar22 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar107._8_4_;
  bVar22 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar107._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(auVar217,ZEXT1632(auVar236));
  uVar99 = vcmpps_avx512vl(auVar115,auVar213,1);
  bVar22 = (bool)((byte)uVar99 & 1);
  auVar115._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar236._0_4_;
  bVar22 = (bool)((byte)(uVar99 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar236._4_4_;
  bVar22 = (bool)((byte)(uVar99 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar236._8_4_;
  bVar22 = (bool)((byte)(uVar99 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * auVar236._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar99 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar99 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar99 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar99 >> 7) * 0x219392ef;
  auVar114 = vrcp14ps_avx512vl(auVar112);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar214._16_4_ = 0x3f800000;
  auVar214._20_4_ = 0x3f800000;
  auVar214._24_4_ = 0x3f800000;
  auVar214._28_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar112,auVar114,auVar214);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar123);
  auVar107 = vfnmadd213ps_fma(auVar123,auVar114,auVar214);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar114,auVar114);
  auVar114 = vrcp14ps_avx512vl(auVar115);
  auVar236 = vfnmadd213ps_fma(auVar115,auVar114,auVar214);
  auVar236 = vfmadd132ps_fma(ZEXT1632(auVar236),auVar114,auVar114);
  fVar194 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar32 + 0x16)) *
            *(float *)(prim + lVar32 + 0x1a);
  auVar210._4_4_ = fVar194;
  auVar210._0_4_ = fVar194;
  auVar210._8_4_ = fVar194;
  auVar210._12_4_ = fVar194;
  auVar210._16_4_ = fVar194;
  auVar210._20_4_ = fVar194;
  auVar210._24_4_ = fVar194;
  auVar210._28_4_ = fVar194;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xb + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar7 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vcvtdq2ps_avx(auVar126);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0xd + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar8 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x12 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  uVar99 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 2 + uVar99 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar9 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x18 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar10 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x1d + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 + (ulong)(byte)PVar13 * 0x20 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar11 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar13 * 0x20 - uVar97) + 6)
                           );
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x23 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,auVar115);
  auVar12 = vfmadd213ps_fma(auVar114,auVar210,auVar115);
  auVar115 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar164));
  auVar124._4_4_ = auVar106._4_4_ * auVar115._4_4_;
  auVar124._0_4_ = auVar106._0_4_ * auVar115._0_4_;
  auVar124._8_4_ = auVar106._8_4_ * auVar115._8_4_;
  auVar124._12_4_ = auVar106._12_4_ * auVar115._12_4_;
  auVar124._16_4_ = auVar115._16_4_ * 0.0;
  auVar124._20_4_ = auVar115._20_4_ * 0.0;
  auVar124._24_4_ = auVar115._24_4_ * 0.0;
  auVar124._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar164));
  auVar184._0_4_ = auVar106._0_4_ * auVar115._0_4_;
  auVar184._4_4_ = auVar106._4_4_ * auVar115._4_4_;
  auVar184._8_4_ = auVar106._8_4_ * auVar115._8_4_;
  auVar184._12_4_ = auVar106._12_4_ * auVar115._12_4_;
  auVar184._16_4_ = auVar115._16_4_ * 0.0;
  auVar184._20_4_ = auVar115._20_4_ * 0.0;
  auVar184._24_4_ = auVar115._24_4_ * 0.0;
  auVar184._28_4_ = 0;
  auVar115 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar108));
  auVar118._4_4_ = auVar107._4_4_ * auVar115._4_4_;
  auVar118._0_4_ = auVar107._0_4_ * auVar115._0_4_;
  auVar118._8_4_ = auVar107._8_4_ * auVar115._8_4_;
  auVar118._12_4_ = auVar107._12_4_ * auVar115._12_4_;
  auVar118._16_4_ = auVar115._16_4_ * 0.0;
  auVar118._20_4_ = auVar115._20_4_ * 0.0;
  auVar118._24_4_ = auVar115._24_4_ * 0.0;
  auVar118._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar108));
  auVar177._0_4_ = auVar107._0_4_ * auVar115._0_4_;
  auVar177._4_4_ = auVar107._4_4_ * auVar115._4_4_;
  auVar177._8_4_ = auVar107._8_4_ * auVar115._8_4_;
  auVar177._12_4_ = auVar107._12_4_ * auVar115._12_4_;
  auVar177._16_4_ = auVar115._16_4_ * 0.0;
  auVar177._20_4_ = auVar115._20_4_ * 0.0;
  auVar177._24_4_ = auVar115._24_4_ * 0.0;
  auVar177._28_4_ = 0;
  auVar115 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar109));
  auVar120._4_4_ = auVar236._4_4_ * auVar115._4_4_;
  auVar120._0_4_ = auVar236._0_4_ * auVar115._0_4_;
  auVar120._8_4_ = auVar236._8_4_ * auVar115._8_4_;
  auVar120._12_4_ = auVar236._12_4_ * auVar115._12_4_;
  auVar120._16_4_ = auVar115._16_4_ * 0.0;
  auVar120._20_4_ = auVar115._20_4_ * 0.0;
  auVar120._24_4_ = auVar115._24_4_ * 0.0;
  auVar120._28_4_ = auVar115._28_4_;
  auVar115 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar109));
  auVar138._0_4_ = auVar236._0_4_ * auVar115._0_4_;
  auVar138._4_4_ = auVar236._4_4_ * auVar115._4_4_;
  auVar138._8_4_ = auVar236._8_4_ * auVar115._8_4_;
  auVar138._12_4_ = auVar236._12_4_ * auVar115._12_4_;
  auVar138._16_4_ = auVar115._16_4_ * 0.0;
  auVar138._20_4_ = auVar115._20_4_ * 0.0;
  auVar138._24_4_ = auVar115._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar124,auVar184);
  auVar114 = vpminsd_avx2(auVar118,auVar177);
  auVar115 = vmaxps_avx(auVar115,auVar114);
  auVar114 = vpminsd_avx2(auVar120,auVar138);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar126._4_4_ = uVar162;
  auVar126._0_4_ = uVar162;
  auVar126._8_4_ = uVar162;
  auVar126._12_4_ = uVar162;
  auVar126._16_4_ = uVar162;
  auVar126._20_4_ = uVar162;
  auVar126._24_4_ = uVar162;
  auVar126._28_4_ = uVar162;
  auVar114 = vmaxps_avx512vl(auVar114,auVar126);
  auVar115 = vmaxps_avx(auVar115,auVar114);
  auVar114._8_4_ = 0x3f7ffffa;
  auVar114._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar114._12_4_ = 0x3f7ffffa;
  auVar114._16_4_ = 0x3f7ffffa;
  auVar114._20_4_ = 0x3f7ffffa;
  auVar114._24_4_ = 0x3f7ffffa;
  auVar114._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar115,auVar114);
  auVar115 = vpmaxsd_avx2(auVar124,auVar184);
  auVar114 = vpmaxsd_avx2(auVar118,auVar177);
  auVar115 = vminps_avx(auVar115,auVar114);
  auVar114 = vpmaxsd_avx2(auVar120,auVar138);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar125._4_4_ = uVar162;
  auVar125._0_4_ = uVar162;
  auVar125._8_4_ = uVar162;
  auVar125._12_4_ = uVar162;
  auVar125._16_4_ = uVar162;
  auVar125._20_4_ = uVar162;
  auVar125._24_4_ = uVar162;
  auVar125._28_4_ = uVar162;
  auVar114 = vminps_avx512vl(auVar114,auVar125);
  auVar115 = vminps_avx(auVar115,auVar114);
  auVar116._8_4_ = 0x3f800003;
  auVar116._0_8_ = 0x3f8000033f800003;
  auVar116._12_4_ = 0x3f800003;
  auVar116._16_4_ = 0x3f800003;
  auVar116._20_4_ = 0x3f800003;
  auVar116._24_4_ = 0x3f800003;
  auVar116._28_4_ = 0x3f800003;
  auVar115 = vmulps_avx512vl(auVar115,auVar116);
  auVar114 = vpbroadcastd_avx512vl();
  uVar29 = vpcmpgtd_avx512vl(auVar114,_DAT_0205a920);
  uVar163 = vcmpps_avx512vl(local_80,auVar115,2);
  if ((byte)((byte)uVar163 & (byte)uVar29) != 0) {
    uVar99 = (ulong)(byte)((byte)uVar163 & (byte)uVar29);
    local_608 = pre->ray_space + k;
    local_738 = (undefined1 (*) [32])&local_1a0;
    local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar32 = 0;
      for (uVar97 = uVar99; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar101 = *(uint *)(prim + 2);
      uVar14 = *(uint *)(prim + lVar32 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar101].ptr;
      uVar97 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                               (ulong)uVar14 *
                               pGVar17[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar194 = (pGVar17->time_range).lower;
      fVar194 = pGVar17->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar194) /
                ((pGVar17->time_range).upper - fVar194));
      auVar106 = vroundss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),9);
      auVar106 = vminss_avx(auVar106,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar106 = vmaxss_avx(ZEXT816(0) << 0x20,auVar106);
      fVar194 = fVar194 - auVar106._0_4_;
      fVar161 = 1.0 - fVar194;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar102 = (long)(int)auVar106._0_4_ * 0x38;
      lVar100 = *(long *)(_Var18 + 0x10 + lVar102);
      lVar19 = *(long *)(_Var18 + 0x38 + lVar102);
      lVar20 = *(long *)(_Var18 + 0x48 + lVar102);
      auVar164._4_4_ = fVar194;
      auVar164._0_4_ = fVar194;
      auVar164._8_4_ = fVar194;
      auVar164._12_4_ = fVar194;
      pfVar3 = (float *)(lVar19 + lVar20 * uVar97);
      auVar216._0_4_ = fVar194 * *pfVar3;
      auVar216._4_4_ = fVar194 * pfVar3[1];
      auVar216._8_4_ = fVar194 * pfVar3[2];
      auVar216._12_4_ = fVar194 * pfVar3[3];
      lVar32 = uVar97 + 1;
      auVar106 = vmulps_avx512vl(auVar164,*(undefined1 (*) [16])(lVar19 + lVar20 * lVar32));
      p_Var21 = pGVar17[4].occlusionFilterN;
      auVar108._4_4_ = fVar161;
      auVar108._0_4_ = fVar161;
      auVar108._8_4_ = fVar161;
      auVar108._12_4_ = fVar161;
      auVar7 = vfmadd231ps_fma(auVar216,auVar108,
                               *(undefined1 (*) [16])
                                (*(long *)(_Var18 + lVar102) + lVar100 * uVar97));
      _local_6f0 = vfmadd231ps_avx512vl
                             (auVar106,auVar108,
                              *(undefined1 (*) [16])(*(long *)(_Var18 + lVar102) + lVar100 * lVar32)
                             );
      pfVar3 = (float *)(*(long *)(p_Var21 + lVar102 + 0x38) +
                        uVar97 * *(long *)(p_Var21 + lVar102 + 0x48));
      auVar219._0_4_ = fVar194 * *pfVar3;
      auVar219._4_4_ = fVar194 * pfVar3[1];
      auVar219._8_4_ = fVar194 * pfVar3[2];
      auVar219._12_4_ = fVar194 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var21 + lVar102 + 0x38) +
                        *(long *)(p_Var21 + lVar102 + 0x48) * lVar32);
      auVar222._0_4_ = fVar194 * *pfVar3;
      auVar222._4_4_ = fVar194 * pfVar3[1];
      auVar222._8_4_ = fVar194 * pfVar3[2];
      auVar222._12_4_ = fVar194 * pfVar3[3];
      auVar107 = vfmadd231ps_fma(auVar219,auVar108,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var21 + lVar102) +
                                  *(long *)(p_Var21 + lVar102 + 0x10) * uVar97));
      auVar236 = vfmadd231ps_fma(auVar222,auVar108,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var21 + lVar102) +
                                  *(long *)(p_Var21 + lVar102 + 0x10) * lVar32));
      iVar15 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      lVar32 = (long)iVar15 * 0x44;
      auVar109._8_4_ = 0xbeaaaaab;
      auVar109._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar109._12_4_ = 0xbeaaaaab;
      local_700 = vfnmadd213ps_fma(auVar107,auVar109,auVar7);
      local_710 = vfmadd213ps_avx512vl(auVar236,auVar109,_local_6f0);
      auVar236 = vsubps_avx(auVar7,auVar106);
      uVar162 = auVar236._0_4_;
      auVar110._4_4_ = uVar162;
      auVar110._0_4_ = uVar162;
      auVar110._8_4_ = uVar162;
      auVar110._12_4_ = uVar162;
      auVar107 = vshufps_avx(auVar236,auVar236,0x55);
      aVar5 = (local_608->vx).field_0;
      aVar6 = (local_608->vy).field_0;
      fVar194 = (local_608->vz).field_0.m128[0];
      fVar161 = *(float *)((long)&(local_608->vz).field_0 + 4);
      fVar201 = *(float *)((long)&(local_608->vz).field_0 + 8);
      fVar202 = *(float *)((long)&(local_608->vz).field_0 + 0xc);
      auVar236 = vshufps_avx(auVar236,auVar236,0xaa);
      auVar221._0_4_ = fVar194 * auVar236._0_4_;
      auVar221._4_4_ = fVar161 * auVar236._4_4_;
      auVar221._8_4_ = fVar201 * auVar236._8_4_;
      auVar221._12_4_ = fVar202 * auVar236._12_4_;
      auVar107 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar6,auVar107);
      auVar8 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar110);
      auVar236 = vsubps_avx(local_700,auVar106);
      uVar162 = auVar236._0_4_;
      auVar178._4_4_ = uVar162;
      auVar178._0_4_ = uVar162;
      auVar178._8_4_ = uVar162;
      auVar178._12_4_ = uVar162;
      auVar107 = vshufps_avx(auVar236,auVar236,0x55);
      auVar236 = vshufps_avx(auVar236,auVar236,0xaa);
      auVar223._0_4_ = fVar194 * auVar236._0_4_;
      auVar223._4_4_ = fVar161 * auVar236._4_4_;
      auVar223._8_4_ = fVar201 * auVar236._8_4_;
      auVar223._12_4_ = fVar202 * auVar236._12_4_;
      auVar107 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar6,auVar107);
      auVar9 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar178);
      auVar236 = vsubps_avx(local_710,auVar106);
      uVar162 = auVar236._0_4_;
      auVar179._4_4_ = uVar162;
      auVar179._0_4_ = uVar162;
      auVar179._8_4_ = uVar162;
      auVar179._12_4_ = uVar162;
      auVar107 = vshufps_avx(auVar236,auVar236,0x55);
      auVar236 = vshufps_avx(auVar236,auVar236,0xaa);
      auVar224._0_4_ = fVar194 * auVar236._0_4_;
      auVar224._4_4_ = fVar161 * auVar236._4_4_;
      auVar224._8_4_ = fVar201 * auVar236._8_4_;
      auVar224._12_4_ = fVar202 * auVar236._12_4_;
      auVar107 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar6,auVar107);
      auVar236 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar179);
      auVar107 = vsubps_avx512vl(_local_6f0,auVar106);
      uVar162 = auVar107._0_4_;
      auVar176._4_4_ = uVar162;
      auVar176._0_4_ = uVar162;
      auVar176._8_4_ = uVar162;
      auVar176._12_4_ = uVar162;
      auVar106 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar229._0_4_ = fVar194 * auVar107._0_4_;
      auVar229._4_4_ = fVar161 * auVar107._4_4_;
      auVar229._8_4_ = fVar201 * auVar107._8_4_;
      auVar229._12_4_ = fVar202 * auVar107._12_4_;
      auVar106 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar6,auVar106);
      auVar10 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar176);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar32);
      uVar162 = auVar8._0_4_;
      local_560._4_4_ = uVar162;
      local_560._0_4_ = uVar162;
      local_560._8_4_ = uVar162;
      local_560._12_4_ = uVar162;
      local_560._16_4_ = uVar162;
      local_560._20_4_ = uVar162;
      local_560._24_4_ = uVar162;
      local_560._28_4_ = uVar162;
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x484);
      auVar169._8_4_ = 1;
      auVar169._0_8_ = 0x100000001;
      auVar169._12_4_ = 1;
      auVar169._16_4_ = 1;
      auVar169._20_4_ = 1;
      auVar169._24_4_ = 1;
      auVar169._28_4_ = 1;
      local_4e0 = vpermps_avx2(auVar169,ZEXT1632(auVar8));
      local_580 = vbroadcastss_avx512vl(auVar9);
      local_500 = vpermps_avx512vl(auVar169,ZEXT1632(auVar9));
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x908);
      local_5a0 = vbroadcastss_avx512vl(auVar236);
      local_5c0 = vpermps_avx512vl(auVar169,ZEXT1632(auVar236));
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0xd8c);
      uVar162 = auVar10._0_4_;
      local_520._4_4_ = uVar162;
      local_520._0_4_ = uVar162;
      local_520._8_4_ = uVar162;
      local_520._12_4_ = uVar162;
      local_520._16_4_ = uVar162;
      local_520._20_4_ = uVar162;
      local_520._24_4_ = uVar162;
      local_520._28_4_ = uVar162;
      local_540 = vpermps_avx2(auVar169,ZEXT1632(auVar10));
      auVar116 = vmulps_avx512vl(local_520,auVar125);
      auVar117 = vmulps_avx512vl(local_540,auVar125);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar126,local_5a0);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar126,local_5c0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,local_580);
      auVar118 = vfmadd231ps_avx512vl(auVar117,auVar114,local_500);
      auVar119 = vfmadd231ps_avx512vl(auVar116,auVar115,local_560);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar32);
      auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x484);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x908);
      auVar113 = vfmadd231ps_avx512vl(auVar118,auVar115,local_4e0);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0xd8c);
      auVar242 = ZEXT3264(local_520);
      auVar120 = vmulps_avx512vl(local_520,auVar118);
      auVar243 = ZEXT3264(local_540);
      auVar121 = vmulps_avx512vl(local_540,auVar118);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,local_5a0);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_5c0);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,local_580);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar117,local_500);
      auVar11 = vfmadd231ps_fma(auVar120,auVar116,local_560);
      auVar12 = vfmadd231ps_fma(auVar121,auVar116,local_4e0);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar11),auVar119);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar12),auVar113);
      auVar120 = vmulps_avx512vl(auVar113,auVar121);
      auVar111 = vmulps_avx512vl(auVar119,auVar122);
      auVar120 = vsubps_avx512vl(auVar120,auVar111);
      auVar106 = vshufps_avx(auVar7,auVar7,0xff);
      uVar163 = auVar106._0_8_;
      local_a0._8_8_ = uVar163;
      local_a0._0_8_ = uVar163;
      local_a0._16_8_ = uVar163;
      local_a0._24_8_ = uVar163;
      auVar106 = vshufps_avx(local_700,local_700,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx(local_710,local_710,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar106);
      auVar106 = vshufps_avx512vl(_local_6f0,_local_6f0,0xff);
      uVar163 = auVar106._0_8_;
      register0x00001248 = uVar163;
      local_100 = uVar163;
      register0x00001250 = uVar163;
      register0x00001258 = uVar163;
      auVar111 = vmulps_avx512vl(_local_100,auVar125);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar126,local_e0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_c0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar115,local_a0);
      auVar112 = vmulps_avx512vl(_local_100,auVar118);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar124,local_e0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_c0);
      auVar164 = vfmadd231ps_fma(auVar112,auVar116,local_a0);
      auVar112 = vmulps_avx512vl(auVar122,auVar122);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar121,auVar121);
      auVar123 = vmaxps_avx512vl(auVar111,ZEXT1632(auVar164));
      auVar123 = vmulps_avx512vl(auVar123,auVar123);
      auVar112 = vmulps_avx512vl(auVar123,auVar112);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      uVar163 = vcmpps_avx512vl(auVar120,auVar112,2);
      auVar106 = vblendps_avx(auVar8,auVar7,8);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar107 = vandps_avx512vl(auVar106,auVar108);
      auVar106 = vblendps_avx(auVar9,local_700,8);
      auVar106 = vandps_avx512vl(auVar106,auVar108);
      auVar107 = vmaxps_avx(auVar107,auVar106);
      auVar106 = vblendps_avx(auVar236,local_710,8);
      auVar109 = vandps_avx512vl(auVar106,auVar108);
      auVar106 = vblendps_avx(auVar10,_local_6f0,8);
      auVar106 = vandps_avx512vl(auVar106,auVar108);
      auVar106 = vmaxps_avx(auVar109,auVar106);
      auVar106 = vmaxps_avx(auVar107,auVar106);
      auVar107 = vmovshdup_avx(auVar106);
      auVar107 = vmaxss_avx(auVar107,auVar106);
      auVar106 = vshufpd_avx(auVar106,auVar106,1);
      auVar106 = vmaxss_avx(auVar106,auVar107);
      auVar107 = vcvtsi2ss_avx512f(_local_6f0,iVar15);
      auVar218._0_4_ = auVar107._0_4_;
      auVar218._4_4_ = auVar218._0_4_;
      auVar218._8_4_ = auVar218._0_4_;
      auVar218._12_4_ = auVar218._0_4_;
      auVar218._16_4_ = auVar218._0_4_;
      auVar218._20_4_ = auVar218._0_4_;
      auVar218._24_4_ = auVar218._0_4_;
      auVar218._28_4_ = auVar218._0_4_;
      uVar29 = vcmpps_avx512vl(auVar218,_DAT_02020f40,0xe);
      bVar103 = (byte)uVar163 & (byte)uVar29;
      local_730 = vmulss_avx512f(auVar106,ZEXT416(0x35000000));
      auVar191._8_4_ = 2;
      auVar191._0_8_ = 0x200000002;
      auVar191._12_4_ = 2;
      auVar191._16_4_ = 2;
      auVar191._20_4_ = 2;
      auVar191._24_4_ = 2;
      auVar191._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar191,ZEXT1632(auVar8));
      local_140 = vpermps_avx512vl(auVar191,ZEXT1632(auVar9));
      local_160 = vpermps_avx512vl(auVar191,ZEXT1632(auVar236));
      auVar120 = vpermps_avx2(auVar191,ZEXT1632(auVar10));
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x60);
      auVar106 = local_140._0_16_;
      uVar226 = local_730._0_4_;
      local_780 = auVar7._0_8_;
      uStack_778 = auVar7._8_8_;
      if (bVar103 == 0) {
        auVar106 = vxorps_avx512vl(auVar106,auVar106);
        auVar237 = ZEXT1664(auVar106);
        auVar235 = ZEXT3264(local_560);
        auVar233 = ZEXT3264(local_4e0);
        auVar238 = ZEXT3264(local_580);
        auVar239 = ZEXT3264(local_500);
        auVar240 = ZEXT3264(local_5a0);
        auVar241 = ZEXT3264(local_5c0);
      }
      else {
        uStack_5fc = 0;
        uStack_5f8 = 0;
        uStack_5f4 = 0;
        auVar118 = vmulps_avx512vl(auVar120,auVar118);
        auVar124 = vfmadd213ps_avx512vl(auVar124,local_160,auVar118);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar124);
        auVar117 = vfmadd213ps_avx512vl(auVar116,local_120,auVar117);
        auVar125 = vmulps_avx512vl(auVar120,auVar125);
        auVar126 = vfmadd213ps_avx512vl(auVar126,local_160,auVar125);
        auVar124 = vfmadd213ps_avx512vl(auVar114,local_140,auVar126);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1210);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1694);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar32 + 0x1f9c);
        auVar124 = vfmadd213ps_avx512vl(auVar115,local_120,auVar124);
        auVar115 = vmulps_avx512vl(local_520,auVar116);
        auVar118 = vmulps_avx512vl(local_540,auVar116);
        auVar225._0_4_ = auVar120._0_4_ * auVar116._0_4_;
        auVar225._4_4_ = auVar120._4_4_ * auVar116._4_4_;
        auVar225._8_4_ = auVar120._8_4_ * auVar116._8_4_;
        auVar225._12_4_ = auVar120._12_4_ * auVar116._12_4_;
        auVar225._16_4_ = auVar120._16_4_ * auVar116._16_4_;
        auVar225._20_4_ = auVar120._20_4_ * auVar116._20_4_;
        auVar225._24_4_ = auVar120._24_4_ * auVar116._24_4_;
        auVar225._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_5a0);
        auVar116 = vfmadd231ps_avx512vl(auVar118,auVar125,local_5c0);
        auVar125 = vfmadd231ps_avx512vl(auVar225,local_160,auVar125);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar126,local_580);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar126,local_500);
        auVar118 = vfmadd231ps_avx512vl(auVar125,local_140,auVar126);
        auVar112 = vfmadd231ps_avx512vl(auVar115,auVar114,local_560);
        auVar233 = ZEXT3264(local_4e0);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,local_4e0);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1210);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1b18);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1f9c);
        auVar118 = vfmadd231ps_avx512vl(auVar118,local_120,auVar114);
        auVar114 = vmulps_avx512vl(local_520,auVar125);
        auVar123 = vmulps_avx512vl(local_540,auVar125);
        auVar44._4_4_ = auVar120._4_4_ * auVar125._4_4_;
        auVar44._0_4_ = auVar120._0_4_ * auVar125._0_4_;
        auVar44._8_4_ = auVar120._8_4_ * auVar125._8_4_;
        auVar44._12_4_ = auVar120._12_4_ * auVar125._12_4_;
        auVar44._16_4_ = auVar120._16_4_ * auVar125._16_4_;
        auVar44._20_4_ = auVar120._20_4_ * auVar125._20_4_;
        auVar44._24_4_ = auVar120._24_4_ * auVar125._24_4_;
        auVar44._28_4_ = auVar125._28_4_;
        auVar125 = vfmadd231ps_avx512vl(auVar114,auVar126,local_5a0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar126,local_5c0);
        auVar126 = vfmadd231ps_avx512vl(auVar44,local_160,auVar126);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar32 + 0x1694);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar114,local_580);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,local_500);
        auVar114 = vfmadd231ps_avx512vl(auVar126,local_140,auVar114);
        auVar126 = vfmadd231ps_avx512vl(auVar125,auVar115,local_560);
        auVar125 = vfmadd231ps_avx512vl(auVar123,auVar115,local_4e0);
        auVar123 = vfmadd231ps_avx512vl(auVar114,local_120,auVar115);
        auVar231._8_4_ = 0x7fffffff;
        auVar231._0_8_ = 0x7fffffff7fffffff;
        auVar231._12_4_ = 0x7fffffff;
        auVar231._16_4_ = 0x7fffffff;
        auVar231._20_4_ = 0x7fffffff;
        auVar231._24_4_ = 0x7fffffff;
        auVar231._28_4_ = 0x7fffffff;
        auVar115 = vandps_avx(auVar112,auVar231);
        auVar114 = vandps_avx(auVar116,auVar231);
        auVar114 = vmaxps_avx(auVar115,auVar114);
        auVar115 = vandps_avx(auVar118,auVar231);
        auVar115 = vmaxps_avx(auVar114,auVar115);
        auVar118 = vbroadcastss_avx512vl(local_730);
        uVar97 = vcmpps_avx512vl(auVar115,auVar118,1);
        bVar22 = (bool)((byte)uVar97 & 1);
        auVar127._0_4_ = (float)((uint)bVar22 * auVar121._0_4_ | (uint)!bVar22 * auVar112._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar22 * auVar121._4_4_ | (uint)!bVar22 * auVar112._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar22 * auVar121._8_4_ | (uint)!bVar22 * auVar112._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar22 * auVar121._12_4_ | (uint)!bVar22 * auVar112._12_4_);
        bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar22 * auVar121._16_4_ | (uint)!bVar22 * auVar112._16_4_);
        bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar22 * auVar121._20_4_ | (uint)!bVar22 * auVar112._20_4_);
        bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar22 * auVar121._24_4_ | (uint)!bVar22 * auVar112._24_4_);
        bVar22 = SUB81(uVar97 >> 7,0);
        auVar127._28_4_ = (uint)bVar22 * auVar121._28_4_ | (uint)!bVar22 * auVar112._28_4_;
        bVar22 = (bool)((byte)uVar97 & 1);
        auVar128._0_4_ = (float)((uint)bVar22 * auVar122._0_4_ | (uint)!bVar22 * auVar116._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar22 * auVar122._4_4_ | (uint)!bVar22 * auVar116._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar22 * auVar122._8_4_ | (uint)!bVar22 * auVar116._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar22 * auVar122._12_4_ | (uint)!bVar22 * auVar116._12_4_);
        bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar22 * auVar122._16_4_ | (uint)!bVar22 * auVar116._16_4_);
        bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar22 * auVar122._20_4_ | (uint)!bVar22 * auVar116._20_4_);
        bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar22 * auVar122._24_4_ | (uint)!bVar22 * auVar116._24_4_);
        bVar22 = SUB81(uVar97 >> 7,0);
        auVar128._28_4_ = (uint)bVar22 * auVar122._28_4_ | (uint)!bVar22 * auVar116._28_4_;
        auVar115 = vandps_avx(auVar231,auVar126);
        auVar114 = vandps_avx(auVar125,auVar231);
        auVar114 = vmaxps_avx(auVar115,auVar114);
        auVar115 = vandps_avx(auVar123,auVar231);
        auVar115 = vmaxps_avx(auVar114,auVar115);
        uVar97 = vcmpps_avx512vl(auVar115,auVar118,1);
        bVar22 = (bool)((byte)uVar97 & 1);
        auVar129._0_4_ = (float)((uint)bVar22 * auVar121._0_4_ | (uint)!bVar22 * auVar126._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar22 * auVar121._4_4_ | (uint)!bVar22 * auVar126._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar22 * auVar121._8_4_ | (uint)!bVar22 * auVar126._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar22 * auVar121._12_4_ | (uint)!bVar22 * auVar126._12_4_);
        bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar22 * auVar121._16_4_ | (uint)!bVar22 * auVar126._16_4_);
        bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar22 * auVar121._20_4_ | (uint)!bVar22 * auVar126._20_4_);
        bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar22 * auVar121._24_4_ | (uint)!bVar22 * auVar126._24_4_);
        bVar22 = SUB81(uVar97 >> 7,0);
        auVar129._28_4_ = (uint)bVar22 * auVar121._28_4_ | (uint)!bVar22 * auVar126._28_4_;
        bVar22 = (bool)((byte)uVar97 & 1);
        auVar130._0_4_ = (float)((uint)bVar22 * auVar122._0_4_ | (uint)!bVar22 * auVar125._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar22 * auVar122._4_4_ | (uint)!bVar22 * auVar125._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar22 * auVar122._8_4_ | (uint)!bVar22 * auVar125._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar22 * auVar122._12_4_ | (uint)!bVar22 * auVar125._12_4_);
        bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar22 * auVar122._16_4_ | (uint)!bVar22 * auVar125._16_4_);
        bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar22 * auVar122._20_4_ | (uint)!bVar22 * auVar125._20_4_);
        bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar22 * auVar122._24_4_ | (uint)!bVar22 * auVar125._24_4_);
        bVar22 = SUB81(uVar97 >> 7,0);
        auVar130._28_4_ = (uint)bVar22 * auVar122._28_4_ | (uint)!bVar22 * auVar125._28_4_;
        auVar110 = vxorps_avx512vl(auVar106,auVar106);
        auVar237 = ZEXT1664(auVar110);
        auVar115 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar110));
        auVar106 = vfmadd231ps_fma(auVar115,auVar128,auVar128);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        fVar194 = auVar115._0_4_;
        fVar161 = auVar115._4_4_;
        fVar201 = auVar115._8_4_;
        fVar202 = auVar115._12_4_;
        fVar186 = auVar115._16_4_;
        fVar193 = auVar115._20_4_;
        fVar104 = auVar115._24_4_;
        auVar45._4_4_ = fVar161 * fVar161 * fVar161 * auVar106._4_4_ * -0.5;
        auVar45._0_4_ = fVar194 * fVar194 * fVar194 * auVar106._0_4_ * -0.5;
        auVar45._8_4_ = fVar201 * fVar201 * fVar201 * auVar106._8_4_ * -0.5;
        auVar45._12_4_ = fVar202 * fVar202 * fVar202 * auVar106._12_4_ * -0.5;
        auVar45._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar45._20_4_ = fVar193 * fVar193 * fVar193 * -0.0;
        auVar45._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar45._28_4_ = auVar123._28_4_;
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar115 = vfmadd231ps_avx512vl(auVar45,auVar114,auVar115);
        auVar46._4_4_ = auVar128._4_4_ * auVar115._4_4_;
        auVar46._0_4_ = auVar128._0_4_ * auVar115._0_4_;
        auVar46._8_4_ = auVar128._8_4_ * auVar115._8_4_;
        auVar46._12_4_ = auVar128._12_4_ * auVar115._12_4_;
        auVar46._16_4_ = auVar128._16_4_ * auVar115._16_4_;
        auVar46._20_4_ = auVar128._20_4_ * auVar115._20_4_;
        auVar46._24_4_ = auVar128._24_4_ * auVar115._24_4_;
        auVar46._28_4_ = 0;
        auVar47._4_4_ = auVar115._4_4_ * -auVar127._4_4_;
        auVar47._0_4_ = auVar115._0_4_ * -auVar127._0_4_;
        auVar47._8_4_ = auVar115._8_4_ * -auVar127._8_4_;
        auVar47._12_4_ = auVar115._12_4_ * -auVar127._12_4_;
        auVar47._16_4_ = auVar115._16_4_ * -auVar127._16_4_;
        auVar47._20_4_ = auVar115._20_4_ * -auVar127._20_4_;
        auVar47._24_4_ = auVar115._24_4_ * -auVar127._24_4_;
        auVar47._28_4_ = auVar128._28_4_;
        auVar115 = vmulps_avx512vl(auVar115,ZEXT1632(auVar110));
        auVar121 = ZEXT1632(auVar110);
        auVar126 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar121);
        auVar106 = vfmadd231ps_fma(auVar126,auVar130,auVar130);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar106));
        fVar194 = auVar126._0_4_;
        fVar161 = auVar126._4_4_;
        fVar201 = auVar126._8_4_;
        fVar202 = auVar126._12_4_;
        fVar186 = auVar126._16_4_;
        fVar193 = auVar126._20_4_;
        fVar104 = auVar126._24_4_;
        auVar48._4_4_ = fVar161 * fVar161 * fVar161 * auVar106._4_4_ * -0.5;
        auVar48._0_4_ = fVar194 * fVar194 * fVar194 * auVar106._0_4_ * -0.5;
        auVar48._8_4_ = fVar201 * fVar201 * fVar201 * auVar106._8_4_ * -0.5;
        auVar48._12_4_ = fVar202 * fVar202 * fVar202 * auVar106._12_4_ * -0.5;
        auVar48._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar48._20_4_ = fVar193 * fVar193 * fVar193 * -0.0;
        auVar48._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
        auVar48._28_4_ = 0;
        auVar114 = vfmadd231ps_avx512vl(auVar48,auVar114,auVar126);
        auVar49._4_4_ = auVar130._4_4_ * auVar114._4_4_;
        auVar49._0_4_ = auVar130._0_4_ * auVar114._0_4_;
        auVar49._8_4_ = auVar130._8_4_ * auVar114._8_4_;
        auVar49._12_4_ = auVar130._12_4_ * auVar114._12_4_;
        auVar49._16_4_ = auVar130._16_4_ * auVar114._16_4_;
        auVar49._20_4_ = auVar130._20_4_ * auVar114._20_4_;
        auVar49._24_4_ = auVar130._24_4_ * auVar114._24_4_;
        auVar49._28_4_ = auVar126._28_4_;
        auVar50._4_4_ = -auVar129._4_4_ * auVar114._4_4_;
        auVar50._0_4_ = -auVar129._0_4_ * auVar114._0_4_;
        auVar50._8_4_ = -auVar129._8_4_ * auVar114._8_4_;
        auVar50._12_4_ = -auVar129._12_4_ * auVar114._12_4_;
        auVar50._16_4_ = -auVar129._16_4_ * auVar114._16_4_;
        auVar50._20_4_ = -auVar129._20_4_ * auVar114._20_4_;
        auVar50._24_4_ = -auVar129._24_4_ * auVar114._24_4_;
        auVar50._28_4_ = auVar129._28_4_ ^ 0x80000000;
        auVar114 = vmulps_avx512vl(auVar114,auVar121);
        auVar106 = vfmadd213ps_fma(auVar46,auVar111,auVar119);
        auVar107 = vfmadd213ps_fma(auVar47,auVar111,auVar113);
        auVar126 = vfmadd213ps_avx512vl(auVar115,auVar111,auVar124);
        auVar125 = vfmadd213ps_avx512vl(auVar49,ZEXT1632(auVar164),ZEXT1632(auVar11));
        auVar108 = vfnmadd213ps_fma(auVar46,auVar111,auVar119);
        auVar118 = ZEXT1632(auVar164);
        auVar236 = vfmadd213ps_fma(auVar50,auVar118,ZEXT1632(auVar12));
        auVar109 = vfnmadd213ps_fma(auVar47,auVar111,auVar113);
        auVar8 = vfmadd213ps_fma(auVar114,auVar118,auVar117);
        auVar116 = vfnmadd231ps_avx512vl(auVar124,auVar111,auVar115);
        auVar11 = vfnmadd213ps_fma(auVar49,auVar118,ZEXT1632(auVar11));
        auVar12 = vfnmadd213ps_fma(auVar50,auVar118,ZEXT1632(auVar12));
        auVar176 = vfnmadd231ps_fma(auVar117,ZEXT1632(auVar164),auVar114);
        auVar114 = vsubps_avx512vl(auVar125,ZEXT1632(auVar108));
        auVar115 = vsubps_avx(ZEXT1632(auVar236),ZEXT1632(auVar109));
        auVar117 = vsubps_avx512vl(ZEXT1632(auVar8),auVar116);
        auVar124 = vmulps_avx512vl(auVar115,auVar116);
        auVar9 = vfmsub231ps_fma(auVar124,ZEXT1632(auVar109),auVar117);
        auVar51._4_4_ = auVar108._4_4_ * auVar117._4_4_;
        auVar51._0_4_ = auVar108._0_4_ * auVar117._0_4_;
        auVar51._8_4_ = auVar108._8_4_ * auVar117._8_4_;
        auVar51._12_4_ = auVar108._12_4_ * auVar117._12_4_;
        auVar51._16_4_ = auVar117._16_4_ * 0.0;
        auVar51._20_4_ = auVar117._20_4_ * 0.0;
        auVar51._24_4_ = auVar117._24_4_ * 0.0;
        auVar51._28_4_ = auVar117._28_4_;
        auVar117 = vfmsub231ps_avx512vl(auVar51,auVar116,auVar114);
        auVar52._4_4_ = auVar109._4_4_ * auVar114._4_4_;
        auVar52._0_4_ = auVar109._0_4_ * auVar114._0_4_;
        auVar52._8_4_ = auVar109._8_4_ * auVar114._8_4_;
        auVar52._12_4_ = auVar109._12_4_ * auVar114._12_4_;
        auVar52._16_4_ = auVar114._16_4_ * 0.0;
        auVar52._20_4_ = auVar114._20_4_ * 0.0;
        auVar52._24_4_ = auVar114._24_4_ * 0.0;
        auVar52._28_4_ = auVar114._28_4_;
        auVar10 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar108),auVar115);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar121,auVar117);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar121,ZEXT1632(auVar9));
        auVar122 = ZEXT1632(auVar110);
        uVar97 = vcmpps_avx512vl(auVar115,auVar122,2);
        bVar96 = (byte)uVar97;
        fVar104 = (float)((uint)(bVar96 & 1) * auVar106._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar11._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar153 = (float)((uint)bVar22 * auVar106._4_4_ | (uint)!bVar22 * auVar11._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar154 = (float)((uint)bVar22 * auVar106._8_4_ | (uint)!bVar22 * auVar11._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar157 = (float)((uint)bVar22 * auVar106._12_4_ | (uint)!bVar22 * auVar11._12_4_);
        auVar124 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar154,CONCAT44(fVar153,fVar104))));
        fVar105 = (float)((uint)(bVar96 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * auVar12._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        fVar185 = (float)((uint)bVar22 * auVar107._4_4_ | (uint)!bVar22 * auVar12._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        fVar155 = (float)((uint)bVar22 * auVar107._8_4_ | (uint)!bVar22 * auVar12._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        fVar158 = (float)((uint)bVar22 * auVar107._12_4_ | (uint)!bVar22 * auVar12._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar155,CONCAT44(fVar185,fVar105))));
        auVar131._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar176._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * auVar176._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * auVar176._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * auVar176._12_4_);
        fVar194 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar126._16_4_);
        auVar131._16_4_ = fVar194;
        fVar161 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar126._20_4_);
        auVar131._20_4_ = fVar161;
        fVar201 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar126._24_4_);
        auVar131._24_4_ = fVar201;
        iVar1 = (uint)(byte)(uVar97 >> 7) * auVar126._28_4_;
        auVar131._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar108),auVar125);
        auVar132._0_4_ =
             (uint)(bVar96 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar9._0_4_;
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar22 * auVar114._4_4_ | (uint)!bVar22 * auVar9._4_4_;
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar22 * auVar114._8_4_ | (uint)!bVar22 * auVar9._8_4_;
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar22 * auVar114._12_4_ | (uint)!bVar22 * auVar9._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar114._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar114._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar114._24_4_;
        auVar132._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar109),ZEXT1632(auVar236));
        auVar133._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar107._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar22 * auVar114._4_4_ | (uint)!bVar22 * auVar107._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar22 * auVar114._8_4_ | (uint)!bVar22 * auVar107._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar22 * auVar114._12_4_ | (uint)!bVar22 * auVar107._12_4_);
        fVar202 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar114._16_4_);
        auVar133._16_4_ = fVar202;
        fVar186 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar114._20_4_);
        auVar133._20_4_ = fVar186;
        fVar193 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar114._24_4_);
        auVar133._24_4_ = fVar193;
        auVar133._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(auVar116,ZEXT1632(auVar8));
        auVar134._0_4_ =
             (float)((uint)(bVar96 & 1) * auVar114._0_4_ |
                    (uint)!(bool)(bVar96 & 1) * auVar126._0_4_);
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar22 * auVar114._4_4_ | (uint)!bVar22 * auVar126._4_4_);
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar22 * auVar114._8_4_ | (uint)!bVar22 * auVar126._8_4_);
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar22 * auVar114._12_4_ | (uint)!bVar22 * auVar126._12_4_);
        bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar22 * auVar114._16_4_ | (uint)!bVar22 * auVar126._16_4_);
        bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar22 * auVar114._20_4_ | (uint)!bVar22 * auVar126._20_4_);
        bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar22 * auVar114._24_4_ | (uint)!bVar22 * auVar126._24_4_);
        bVar22 = SUB81(uVar97 >> 7,0);
        auVar134._28_4_ = (uint)bVar22 * auVar114._28_4_ | (uint)!bVar22 * auVar126._28_4_;
        auVar135._0_4_ =
             (uint)(bVar96 & 1) * (int)auVar108._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar125._0_4_;
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar22 * (int)auVar108._4_4_ | (uint)!bVar22 * auVar125._4_4_;
        bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar22 * (int)auVar108._8_4_ | (uint)!bVar22 * auVar125._8_4_;
        bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar22 * (int)auVar108._12_4_ | (uint)!bVar22 * auVar125._12_4_;
        auVar135._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar125._16_4_;
        auVar135._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar125._20_4_;
        auVar135._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar125._24_4_;
        auVar135._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar125._28_4_;
        bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
        bVar24 = (bool)((byte)(uVar97 >> 2) & 1);
        bVar25 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar136._0_4_ =
             (uint)(bVar96 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar8._0_4_;
        bVar23 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar23 * auVar116._4_4_ | (uint)!bVar23 * auVar8._4_4_;
        bVar23 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar23 * auVar116._8_4_ | (uint)!bVar23 * auVar8._8_4_;
        bVar23 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar23 * auVar116._12_4_ | (uint)!bVar23 * auVar8._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar116._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar116._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar116._24_4_;
        iVar2 = (uint)(byte)(uVar97 >> 7) * auVar116._28_4_;
        auVar136._28_4_ = iVar2;
        auVar119 = vsubps_avx512vl(auVar135,auVar124);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar25 * (int)auVar109._12_4_ |
                                                 (uint)!bVar25 * auVar236._12_4_,
                                                 CONCAT48((uint)bVar24 * (int)auVar109._8_4_ |
                                                          (uint)!bVar24 * auVar236._8_4_,
                                                          CONCAT44((uint)bVar22 *
                                                                   (int)auVar109._4_4_ |
                                                                   (uint)!bVar22 * auVar236._4_4_,
                                                                   (uint)(bVar96 & 1) *
                                                                   (int)auVar109._0_4_ |
                                                                   (uint)!(bool)(bVar96 & 1) *
                                                                   auVar236._0_4_)))),auVar118);
        auVar126 = vsubps_avx(auVar136,auVar131);
        auVar125 = vsubps_avx(auVar124,auVar132);
        auVar116 = vsubps_avx(auVar118,auVar133);
        auVar117 = vsubps_avx(auVar131,auVar134);
        auVar53._4_4_ = auVar126._4_4_ * fVar153;
        auVar53._0_4_ = auVar126._0_4_ * fVar104;
        auVar53._8_4_ = auVar126._8_4_ * fVar154;
        auVar53._12_4_ = auVar126._12_4_ * fVar157;
        auVar53._16_4_ = auVar126._16_4_ * 0.0;
        auVar53._20_4_ = auVar126._20_4_ * 0.0;
        auVar53._24_4_ = auVar126._24_4_ * 0.0;
        auVar53._28_4_ = iVar2;
        auVar106 = vfmsub231ps_fma(auVar53,auVar131,auVar119);
        auVar54._4_4_ = fVar185 * auVar119._4_4_;
        auVar54._0_4_ = fVar105 * auVar119._0_4_;
        auVar54._8_4_ = fVar155 * auVar119._8_4_;
        auVar54._12_4_ = fVar158 * auVar119._12_4_;
        auVar54._16_4_ = auVar119._16_4_ * 0.0;
        auVar54._20_4_ = auVar119._20_4_ * 0.0;
        auVar54._24_4_ = auVar119._24_4_ * 0.0;
        auVar54._28_4_ = auVar115._28_4_;
        auVar107 = vfmsub231ps_fma(auVar54,auVar124,auVar114);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar122,ZEXT1632(auVar106));
        auVar195._0_4_ = auVar114._0_4_ * auVar131._0_4_;
        auVar195._4_4_ = auVar114._4_4_ * auVar131._4_4_;
        auVar195._8_4_ = auVar114._8_4_ * auVar131._8_4_;
        auVar195._12_4_ = auVar114._12_4_ * auVar131._12_4_;
        auVar195._16_4_ = auVar114._16_4_ * fVar194;
        auVar195._20_4_ = auVar114._20_4_ * fVar161;
        auVar195._24_4_ = auVar114._24_4_ * fVar201;
        auVar195._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar195,auVar118,auVar126);
        auVar113 = vfmadd231ps_avx512vl(auVar115,auVar122,ZEXT1632(auVar106));
        auVar115 = vmulps_avx512vl(auVar117,auVar132);
        auVar115 = vfmsub231ps_avx512vl(auVar115,auVar125,auVar134);
        auVar55._4_4_ = auVar116._4_4_ * auVar134._4_4_;
        auVar55._0_4_ = auVar116._0_4_ * auVar134._0_4_;
        auVar55._8_4_ = auVar116._8_4_ * auVar134._8_4_;
        auVar55._12_4_ = auVar116._12_4_ * auVar134._12_4_;
        auVar55._16_4_ = auVar116._16_4_ * auVar134._16_4_;
        auVar55._20_4_ = auVar116._20_4_ * auVar134._20_4_;
        auVar55._24_4_ = auVar116._24_4_ * auVar134._24_4_;
        auVar55._28_4_ = auVar134._28_4_;
        auVar106 = vfmsub231ps_fma(auVar55,auVar133,auVar117);
        auVar196._0_4_ = auVar133._0_4_ * auVar125._0_4_;
        auVar196._4_4_ = auVar133._4_4_ * auVar125._4_4_;
        auVar196._8_4_ = auVar133._8_4_ * auVar125._8_4_;
        auVar196._12_4_ = auVar133._12_4_ * auVar125._12_4_;
        auVar196._16_4_ = fVar202 * auVar125._16_4_;
        auVar196._20_4_ = fVar186 * auVar125._20_4_;
        auVar196._24_4_ = fVar193 * auVar125._24_4_;
        auVar196._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar196,auVar116,auVar132);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar122,auVar115);
        auVar121 = vfmadd231ps_avx512vl(auVar115,auVar122,ZEXT1632(auVar106));
        auVar115 = vmaxps_avx(auVar113,auVar121);
        uVar163 = vcmpps_avx512vl(auVar115,auVar122,2);
        bVar103 = bVar103 & (byte)uVar163;
        auVar235 = ZEXT3264(local_560);
        auVar238 = ZEXT3264(local_580);
        auVar239 = ZEXT3264(local_500);
        auVar240 = ZEXT3264(local_5a0);
        auVar241 = ZEXT3264(local_5c0);
        auVar242 = ZEXT3264(local_520);
        auVar228 = ZEXT1664(local_730);
        if (bVar103 == 0) {
          bVar103 = 0;
        }
        else {
          auVar56._4_4_ = auVar117._4_4_ * auVar114._4_4_;
          auVar56._0_4_ = auVar117._0_4_ * auVar114._0_4_;
          auVar56._8_4_ = auVar117._8_4_ * auVar114._8_4_;
          auVar56._12_4_ = auVar117._12_4_ * auVar114._12_4_;
          auVar56._16_4_ = auVar117._16_4_ * auVar114._16_4_;
          auVar56._20_4_ = auVar117._20_4_ * auVar114._20_4_;
          auVar56._24_4_ = auVar117._24_4_ * auVar114._24_4_;
          auVar56._28_4_ = auVar115._28_4_;
          auVar236 = vfmsub231ps_fma(auVar56,auVar116,auVar126);
          auVar57._4_4_ = auVar126._4_4_ * auVar125._4_4_;
          auVar57._0_4_ = auVar126._0_4_ * auVar125._0_4_;
          auVar57._8_4_ = auVar126._8_4_ * auVar125._8_4_;
          auVar57._12_4_ = auVar126._12_4_ * auVar125._12_4_;
          auVar57._16_4_ = auVar126._16_4_ * auVar125._16_4_;
          auVar57._20_4_ = auVar126._20_4_ * auVar125._20_4_;
          auVar57._24_4_ = auVar126._24_4_ * auVar125._24_4_;
          auVar57._28_4_ = auVar126._28_4_;
          auVar107 = vfmsub231ps_fma(auVar57,auVar119,auVar117);
          auVar58._4_4_ = auVar116._4_4_ * auVar119._4_4_;
          auVar58._0_4_ = auVar116._0_4_ * auVar119._0_4_;
          auVar58._8_4_ = auVar116._8_4_ * auVar119._8_4_;
          auVar58._12_4_ = auVar116._12_4_ * auVar119._12_4_;
          auVar58._16_4_ = auVar116._16_4_ * auVar119._16_4_;
          auVar58._20_4_ = auVar116._20_4_ * auVar119._20_4_;
          auVar58._24_4_ = auVar116._24_4_ * auVar119._24_4_;
          auVar58._28_4_ = auVar116._28_4_;
          auVar8 = vfmsub231ps_fma(auVar58,auVar125,auVar114);
          auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar8));
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar236),auVar122);
          auVar114 = vrcp14ps_avx512vl(auVar115);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar126 = vfnmadd213ps_avx512vl(auVar114,auVar115,auVar33);
          auVar106 = vfmadd132ps_fma(auVar126,auVar114,auVar114);
          auVar59._4_4_ = auVar8._4_4_ * auVar131._4_4_;
          auVar59._0_4_ = auVar8._0_4_ * auVar131._0_4_;
          auVar59._8_4_ = auVar8._8_4_ * auVar131._8_4_;
          auVar59._12_4_ = auVar8._12_4_ * auVar131._12_4_;
          auVar59._16_4_ = fVar194 * 0.0;
          auVar59._20_4_ = fVar161 * 0.0;
          auVar59._24_4_ = fVar201 * 0.0;
          auVar59._28_4_ = iVar1;
          auVar107 = vfmadd231ps_fma(auVar59,auVar118,ZEXT1632(auVar107));
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar124,ZEXT1632(auVar236));
          fVar194 = auVar106._0_4_;
          fVar161 = auVar106._4_4_;
          fVar201 = auVar106._8_4_;
          fVar202 = auVar106._12_4_;
          auVar114 = ZEXT1632(CONCAT412(auVar107._12_4_ * fVar202,
                                        CONCAT48(auVar107._8_4_ * fVar201,
                                                 CONCAT44(auVar107._4_4_ * fVar161,
                                                          auVar107._0_4_ * fVar194))));
          auVar215._4_4_ = uVar162;
          auVar215._0_4_ = uVar162;
          auVar215._8_4_ = uVar162;
          auVar215._12_4_ = uVar162;
          auVar215._16_4_ = uVar162;
          auVar215._20_4_ = uVar162;
          auVar215._24_4_ = uVar162;
          auVar215._28_4_ = uVar162;
          uVar163 = vcmpps_avx512vl(auVar215,auVar114,2);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar34._4_4_ = uVar4;
          auVar34._0_4_ = uVar4;
          auVar34._8_4_ = uVar4;
          auVar34._12_4_ = uVar4;
          auVar34._16_4_ = uVar4;
          auVar34._20_4_ = uVar4;
          auVar34._24_4_ = uVar4;
          auVar34._28_4_ = uVar4;
          uVar29 = vcmpps_avx512vl(auVar114,auVar34,2);
          bVar103 = (byte)uVar163 & (byte)uVar29 & bVar103;
          if (bVar103 != 0) {
            uVar163 = vcmpps_avx512vl(auVar115,auVar122,4);
            if ((bVar103 & (byte)uVar163) != 0) {
              bVar103 = bVar103 & (byte)uVar163;
              fVar186 = auVar113._0_4_ * fVar194;
              fVar193 = auVar113._4_4_ * fVar161;
              auVar60._4_4_ = fVar193;
              auVar60._0_4_ = fVar186;
              fVar104 = auVar113._8_4_ * fVar201;
              auVar60._8_4_ = fVar104;
              fVar105 = auVar113._12_4_ * fVar202;
              auVar60._12_4_ = fVar105;
              fVar153 = auVar113._16_4_ * 0.0;
              auVar60._16_4_ = fVar153;
              fVar185 = auVar113._20_4_ * 0.0;
              auVar60._20_4_ = fVar185;
              fVar154 = auVar113._24_4_ * 0.0;
              auVar60._24_4_ = fVar154;
              auVar60._28_4_ = auVar113._28_4_;
              fVar194 = auVar121._0_4_ * fVar194;
              fVar161 = auVar121._4_4_ * fVar161;
              auVar61._4_4_ = fVar161;
              auVar61._0_4_ = fVar194;
              fVar201 = auVar121._8_4_ * fVar201;
              auVar61._8_4_ = fVar201;
              fVar202 = auVar121._12_4_ * fVar202;
              auVar61._12_4_ = fVar202;
              fVar155 = auVar121._16_4_ * 0.0;
              auVar61._16_4_ = fVar155;
              fVar157 = auVar121._20_4_ * 0.0;
              auVar61._20_4_ = fVar157;
              fVar158 = auVar121._24_4_ * 0.0;
              auVar61._24_4_ = fVar158;
              auVar61._28_4_ = auVar121._28_4_;
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = &DAT_3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar211,auVar60);
              local_680._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar186 | (uint)!(bool)(bVar96 & 1) * auVar115._0_4_;
              bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
              local_680._4_4_ = (uint)bVar22 * (int)fVar193 | (uint)!bVar22 * auVar115._4_4_;
              bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
              local_680._8_4_ = (uint)bVar22 * (int)fVar104 | (uint)!bVar22 * auVar115._8_4_;
              bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
              local_680._12_4_ = (uint)bVar22 * (int)fVar105 | (uint)!bVar22 * auVar115._12_4_;
              bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
              local_680._16_4_ = (uint)bVar22 * (int)fVar153 | (uint)!bVar22 * auVar115._16_4_;
              bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
              local_680._20_4_ = (uint)bVar22 * (int)fVar185 | (uint)!bVar22 * auVar115._20_4_;
              bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
              local_680._24_4_ = (uint)bVar22 * (int)fVar154 | (uint)!bVar22 * auVar115._24_4_;
              bVar22 = SUB81(uVar97 >> 7,0);
              local_680._28_4_ = (uint)bVar22 * auVar113._28_4_ | (uint)!bVar22 * auVar115._28_4_;
              auVar115 = vsubps_avx(auVar211,auVar61);
              bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
              bVar23 = (bool)((byte)(uVar97 >> 2) & 1);
              bVar24 = (bool)((byte)(uVar97 >> 3) & 1);
              bVar25 = (bool)((byte)(uVar97 >> 4) & 1);
              bVar26 = (bool)((byte)(uVar97 >> 5) & 1);
              bVar27 = (bool)((byte)(uVar97 >> 6) & 1);
              bVar28 = SUB81(uVar97 >> 7,0);
              local_300._4_4_ = (uint)bVar22 * (int)fVar161 | (uint)!bVar22 * auVar115._4_4_;
              local_300._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar194 | (uint)!(bool)(bVar96 & 1) * auVar115._0_4_;
              local_300._8_4_ = (uint)bVar23 * (int)fVar201 | (uint)!bVar23 * auVar115._8_4_;
              local_300._12_4_ = (uint)bVar24 * (int)fVar202 | (uint)!bVar24 * auVar115._12_4_;
              local_300._16_4_ = (uint)bVar25 * (int)fVar155 | (uint)!bVar25 * auVar115._16_4_;
              local_300._20_4_ = (uint)bVar26 * (int)fVar157 | (uint)!bVar26 * auVar115._20_4_;
              local_300._24_4_ = (uint)bVar27 * (int)fVar158 | (uint)!bVar27 * auVar115._24_4_;
              local_300._28_4_ = (uint)bVar28 * auVar121._28_4_ | (uint)!bVar28 * auVar115._28_4_;
              local_6a0 = auVar114;
              goto LAB_01ee9623;
            }
          }
          bVar103 = 0;
        }
LAB_01ee9623:
        auVar234 = ZEXT3264(auVar120);
        if (bVar103 != 0) {
          auVar115 = vsubps_avx(ZEXT1632(auVar164),auVar111);
          auVar106 = vfmadd213ps_fma(auVar115,local_680,auVar111);
          uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar35._4_4_ = uVar4;
          auVar35._0_4_ = uVar4;
          auVar35._8_4_ = uVar4;
          auVar35._12_4_ = uVar4;
          auVar35._16_4_ = uVar4;
          auVar35._20_4_ = uVar4;
          auVar35._24_4_ = uVar4;
          auVar35._28_4_ = uVar4;
          auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                        CONCAT48(auVar106._8_4_ + auVar106._8_4_,
                                                                 CONCAT44(auVar106._4_4_ +
                                                                          auVar106._4_4_,
                                                                          auVar106._0_4_ +
                                                                          auVar106._0_4_)))),auVar35
                                    );
          uVar163 = vcmpps_avx512vl(local_6a0,auVar115,6);
          bVar103 = bVar103 & (byte)uVar163;
          if (bVar103 != 0) {
            auVar170._8_4_ = 0xbf800000;
            auVar170._0_8_ = 0xbf800000bf800000;
            auVar170._12_4_ = 0xbf800000;
            auVar170._16_4_ = 0xbf800000;
            auVar170._20_4_ = 0xbf800000;
            auVar170._24_4_ = 0xbf800000;
            auVar170._28_4_ = 0xbf800000;
            auVar36._8_4_ = 0x40000000;
            auVar36._0_8_ = 0x4000000040000000;
            auVar36._12_4_ = 0x40000000;
            auVar36._16_4_ = 0x40000000;
            auVar36._20_4_ = 0x40000000;
            auVar36._24_4_ = 0x40000000;
            auVar36._28_4_ = 0x40000000;
            local_480 = vfmadd132ps_avx512vl(local_300,auVar170,auVar36);
            local_300 = local_480;
            auVar115 = local_300;
            local_440 = 0;
            local_430 = local_780;
            uStack_428 = uStack_778;
            local_420 = local_700._0_8_;
            uStack_418 = local_700._8_8_;
            local_410 = local_710._0_8_;
            uStack_408 = local_710._8_8_;
            local_400 = local_6f0;
            uStack_3f8 = uStack_6e8;
            local_300 = auVar115;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar194 = 1.0 / auVar218._0_4_;
              local_3e0[0] = fVar194 * (local_680._0_4_ + 0.0);
              local_3e0[1] = fVar194 * (local_680._4_4_ + 1.0);
              local_3e0[2] = fVar194 * (local_680._8_4_ + 2.0);
              local_3e0[3] = fVar194 * (local_680._12_4_ + 3.0);
              fStack_3d0 = fVar194 * (local_680._16_4_ + 4.0);
              fStack_3cc = fVar194 * (local_680._20_4_ + 5.0);
              fStack_3c8 = fVar194 * (local_680._24_4_ + 6.0);
              fStack_3c4 = local_680._28_4_ + 7.0;
              local_300._0_8_ = local_480._0_8_;
              local_300._8_8_ = local_480._8_8_;
              local_300._16_8_ = local_480._16_8_;
              local_300._24_8_ = local_480._24_8_;
              local_3c0 = local_300._0_8_;
              uStack_3b8 = local_300._8_8_;
              uStack_3b0 = local_300._16_8_;
              uStack_3a8 = local_300._24_8_;
              local_3a0 = local_6a0;
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar115 = vblendmps_avx512vl(auVar171,local_6a0);
              auVar137._0_4_ =
                   (uint)(bVar103 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar103 & 1) * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar22 * auVar115._16_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar22 * auVar115._20_4_ | (uint)!bVar22 * 0x7f800000;
              bVar22 = (bool)(bVar103 >> 6 & 1);
              auVar137._24_4_ = (uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * 0x7f800000;
              auVar137._28_4_ =
                   (uint)(bVar103 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar103 >> 7) * 0x7f800000
              ;
              auVar115 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar115 = vminps_avx(auVar137,auVar115);
              auVar114 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar114);
              auVar114 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar114);
              uVar163 = vcmpps_avx512vl(auVar137,auVar115,0);
              bVar95 = (byte)uVar163 & bVar103;
              bVar96 = bVar103;
              if (bVar95 != 0) {
                bVar96 = bVar95;
              }
              uVar31 = 0;
              for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                uVar31 = uVar31 + 1;
              }
              uVar97 = (ulong)uVar31;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar194 = local_3e0[uVar97];
                uVar4 = *(undefined4 *)((long)&local_3c0 + uVar97 * 4);
                fVar201 = 1.0 - fVar194;
                fVar161 = fVar201 * fVar201 * -3.0;
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * fVar201)),
                                           ZEXT416((uint)(fVar194 * fVar201)),ZEXT416(0xc0000000));
                auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar194 * fVar201)),
                                           ZEXT416((uint)(fVar194 * fVar194)),ZEXT416(0x40000000));
                fVar201 = auVar106._0_4_ * 3.0;
                fVar202 = auVar107._0_4_ * 3.0;
                fVar186 = fVar194 * fVar194 * 3.0;
                auVar203._0_4_ = fVar186 * (float)local_6f0._0_4_;
                auVar203._4_4_ = fVar186 * (float)local_6f0._4_4_;
                auVar203._8_4_ = fVar186 * (float)uStack_6e8;
                auVar203._12_4_ = fVar186 * uStack_6e8._4_4_;
                auVar180._4_4_ = fVar202;
                auVar180._0_4_ = fVar202;
                auVar180._8_4_ = fVar202;
                auVar180._12_4_ = fVar202;
                auVar106 = vfmadd132ps_fma(auVar180,auVar203,local_710);
                auVar187._4_4_ = fVar201;
                auVar187._0_4_ = fVar201;
                auVar187._8_4_ = fVar201;
                auVar187._12_4_ = fVar201;
                auVar106 = vfmadd132ps_fma(auVar187,auVar106,local_700);
                auVar181._4_4_ = fVar161;
                auVar181._0_4_ = fVar161;
                auVar181._8_4_ = fVar161;
                auVar181._12_4_ = fVar161;
                auVar106 = vfmadd132ps_fma(auVar181,auVar106,auVar7);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar97 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar106._0_4_;
                uVar16 = vextractps_avx(auVar106,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                uVar16 = vextractps_avx(auVar106,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                *(float *)(ray + k * 4 + 0x1e0) = fVar194;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(uint *)(ray + k * 4 + 0x220) = uVar14;
                *(uint *)(ray + k * 4 + 0x240) = uVar101;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_360 = vpbroadcastd_avx512vl();
                local_380 = vpbroadcastd_avx512vl();
                local_720 = local_700._0_4_;
                uStack_71c = local_700._4_4_;
                uStack_718 = local_700._8_8_;
                local_620 = local_710._0_4_;
                uStack_61c = local_710._4_4_;
                uStack_618 = local_710._8_8_;
                local_630 = (float)local_6f0._0_4_;
                fStack_62c = (float)local_6f0._4_4_;
                fStack_628 = (float)uStack_6e8;
                fStack_624 = uStack_6e8._4_4_;
                local_600 = uVar162;
                local_5e0 = auVar120;
                local_4a0 = local_680;
                local_460 = local_6a0;
                local_43c = iVar15;
                local_3f0 = bVar103;
                do {
                  auVar236 = auVar237._0_16_;
                  local_340 = (float)*(undefined4 *)(ray + k * 4 + 0x100);
                  local_220 = local_3e0[uVar97];
                  local_200 = *(undefined4 *)((long)&local_3c0 + uVar97 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar97 * 4);
                  local_768.context = context->user;
                  fVar161 = 1.0 - local_220;
                  fVar194 = fVar161 * fVar161 * -3.0;
                  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),
                                             ZEXT416((uint)(local_220 * fVar161)),
                                             ZEXT416(0xc0000000));
                  auVar107 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar161)),
                                             ZEXT416((uint)(local_220 * local_220)),
                                             ZEXT416(0x40000000));
                  fVar161 = auVar106._0_4_ * 3.0;
                  fVar201 = auVar107._0_4_ * 3.0;
                  fVar202 = local_220 * local_220 * 3.0;
                  auVar206._0_4_ = fVar202 * local_630;
                  auVar206._4_4_ = fVar202 * fStack_62c;
                  auVar206._8_4_ = fVar202 * fStack_628;
                  auVar206._12_4_ = fVar202 * fStack_624;
                  auVar167._4_4_ = fVar201;
                  auVar167._0_4_ = fVar201;
                  auVar167._8_4_ = fVar201;
                  auVar167._12_4_ = fVar201;
                  auVar92._4_4_ = uStack_61c;
                  auVar92._0_4_ = local_620;
                  auVar92._8_8_ = uStack_618;
                  auVar106 = vfmadd132ps_fma(auVar167,auVar206,auVar92);
                  auVar190._4_4_ = fVar161;
                  auVar190._0_4_ = fVar161;
                  auVar190._8_4_ = fVar161;
                  auVar190._12_4_ = fVar161;
                  auVar86._4_4_ = uStack_71c;
                  auVar86._0_4_ = local_720;
                  auVar86._8_8_ = uStack_718;
                  auVar106 = vfmadd132ps_fma(auVar190,auVar106,auVar86);
                  auVar168._4_4_ = fVar194;
                  auVar168._0_4_ = fVar194;
                  auVar168._8_4_ = fVar194;
                  auVar168._12_4_ = fVar194;
                  auVar106 = vfmadd132ps_fma(auVar168,auVar106,auVar7);
                  local_280 = auVar106._0_4_;
                  auVar200._8_4_ = 1;
                  auVar200._0_8_ = 0x100000001;
                  auVar200._12_4_ = 1;
                  auVar200._16_4_ = 1;
                  auVar200._20_4_ = 1;
                  auVar200._24_4_ = 1;
                  auVar200._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar200,ZEXT1632(auVar106));
                  auVar209._8_4_ = 2;
                  auVar209._0_8_ = 0x200000002;
                  auVar209._12_4_ = 2;
                  auVar209._16_4_ = 2;
                  auVar209._20_4_ = 2;
                  auVar209._24_4_ = 2;
                  auVar209._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar209,ZEXT1632(auVar106));
                  iStack_27c = local_280;
                  iStack_278 = local_280;
                  iStack_274 = local_280;
                  iStack_270 = local_280;
                  iStack_26c = local_280;
                  iStack_268 = local_280;
                  iStack_264 = local_280;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_380._0_8_;
                  uStack_1d8 = local_380._8_8_;
                  uStack_1d0 = local_380._16_8_;
                  uStack_1c8 = local_380._24_8_;
                  local_1c0 = local_360;
                  auVar115 = vpcmpeqd_avx2(local_360,local_360);
                  local_738[1] = auVar115;
                  *local_738 = auVar115;
                  local_1a0 = (local_768.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_768.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_660 = local_2a0._0_8_;
                  uStack_658 = local_2a0._8_8_;
                  uStack_650 = local_2a0._16_8_;
                  uStack_648 = local_2a0._24_8_;
                  local_768.valid = (int *)&local_660;
                  local_768.geometryUserPtr = pGVar17->userPtr;
                  local_768.hit = (RTCHitN *)&local_280;
                  local_768.N = 8;
                  local_4c0 = (undefined4)uVar97;
                  uStack_4bc = (undefined4)(uVar97 >> 0x20);
                  local_768.ray = (RTCRayN *)ray;
                  if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar17->intersectionFilterN)(&local_768);
                    uVar97 = CONCAT44(uStack_4bc,local_4c0);
                    auVar228 = ZEXT1664(local_730);
                    auVar234 = ZEXT3264(local_5e0);
                    auVar243 = ZEXT3264(local_540);
                    auVar242 = ZEXT3264(local_520);
                    auVar241 = ZEXT3264(local_5c0);
                    auVar240 = ZEXT3264(local_5a0);
                    auVar239 = ZEXT3264(local_500);
                    auVar238 = ZEXT3264(local_580);
                    auVar233 = ZEXT3264(local_4e0);
                    auVar235 = ZEXT3264(local_560);
                    auVar106 = vxorps_avx512vl(auVar236,auVar236);
                    auVar237 = ZEXT1664(auVar106);
                    uVar162 = local_600;
                  }
                  auVar106 = auVar237._0_16_;
                  auVar89._8_8_ = uStack_658;
                  auVar89._0_8_ = local_660;
                  auVar89._16_8_ = uStack_650;
                  auVar89._24_8_ = uStack_648;
                  if (auVar89 == (undefined1  [32])0x0) {
LAB_01eeacc5:
                    *(float *)(ray + k * 4 + 0x100) = local_340;
                  }
                  else {
                    p_Var21 = context->args->filter;
                    if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var21)(&local_768);
                      uVar97 = CONCAT44(uStack_4bc,local_4c0);
                      auVar228 = ZEXT1664(local_730);
                      auVar234 = ZEXT3264(local_5e0);
                      auVar243 = ZEXT3264(local_540);
                      auVar242 = ZEXT3264(local_520);
                      auVar241 = ZEXT3264(local_5c0);
                      auVar240 = ZEXT3264(local_5a0);
                      auVar239 = ZEXT3264(local_500);
                      auVar238 = ZEXT3264(local_580);
                      auVar233 = ZEXT3264(local_4e0);
                      auVar235 = ZEXT3264(local_560);
                      auVar106 = vxorps_avx512vl(auVar106,auVar106);
                      auVar237 = ZEXT1664(auVar106);
                      uVar162 = local_600;
                    }
                    auVar90._8_8_ = uStack_658;
                    auVar90._0_8_ = local_660;
                    auVar90._16_8_ = uStack_650;
                    auVar90._24_8_ = uStack_648;
                    if (auVar90 == (undefined1  [32])0x0) goto LAB_01eeacc5;
                    uVar30 = vptestmd_avx512vl(auVar90,auVar90);
                    iVar1 = *(int *)(local_768.hit + 4);
                    iVar2 = *(int *)(local_768.hit + 8);
                    iVar81 = *(int *)(local_768.hit + 0xc);
                    iVar82 = *(int *)(local_768.hit + 0x10);
                    iVar83 = *(int *)(local_768.hit + 0x14);
                    iVar84 = *(int *)(local_768.hit + 0x18);
                    iVar85 = *(int *)(local_768.hit + 0x1c);
                    bVar96 = (byte)uVar30;
                    bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                    bVar28 = SUB81(uVar30 >> 7,0);
                    *(uint *)(local_768.ray + 0x180) =
                         (uint)(bVar96 & 1) * *(int *)local_768.hit |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_768.ray + 0x180);
                    *(uint *)(local_768.ray + 0x184) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x184);
                    *(uint *)(local_768.ray + 0x188) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x188);
                    *(uint *)(local_768.ray + 0x18c) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x18c);
                    *(uint *)(local_768.ray + 400) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 400);
                    *(uint *)(local_768.ray + 0x194) =
                         (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x194);
                    *(uint *)(local_768.ray + 0x198) =
                         (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x198);
                    *(uint *)(local_768.ray + 0x19c) =
                         (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x19c);
                    iVar1 = *(int *)(local_768.hit + 0x24);
                    iVar2 = *(int *)(local_768.hit + 0x28);
                    iVar81 = *(int *)(local_768.hit + 0x2c);
                    iVar82 = *(int *)(local_768.hit + 0x30);
                    iVar83 = *(int *)(local_768.hit + 0x34);
                    iVar84 = *(int *)(local_768.hit + 0x38);
                    iVar85 = *(int *)(local_768.hit + 0x3c);
                    bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                    bVar28 = SUB81(uVar30 >> 7,0);
                    *(uint *)(local_768.ray + 0x1a0) =
                         (uint)(bVar96 & 1) * *(int *)(local_768.hit + 0x20) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_768.ray + 0x1a0);
                    *(uint *)(local_768.ray + 0x1a4) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1a4);
                    *(uint *)(local_768.ray + 0x1a8) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1a8);
                    *(uint *)(local_768.ray + 0x1ac) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1ac);
                    *(uint *)(local_768.ray + 0x1b0) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1b0);
                    *(uint *)(local_768.ray + 0x1b4) =
                         (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x1b4);
                    *(uint *)(local_768.ray + 0x1b8) =
                         (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1b8);
                    *(uint *)(local_768.ray + 0x1bc) =
                         (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1bc);
                    iVar1 = *(int *)(local_768.hit + 0x44);
                    iVar2 = *(int *)(local_768.hit + 0x48);
                    iVar81 = *(int *)(local_768.hit + 0x4c);
                    iVar82 = *(int *)(local_768.hit + 0x50);
                    iVar83 = *(int *)(local_768.hit + 0x54);
                    iVar84 = *(int *)(local_768.hit + 0x58);
                    iVar85 = *(int *)(local_768.hit + 0x5c);
                    bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                    bVar28 = SUB81(uVar30 >> 7,0);
                    *(uint *)(local_768.ray + 0x1c0) =
                         (uint)(bVar96 & 1) * *(int *)(local_768.hit + 0x40) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_768.ray + 0x1c0);
                    *(uint *)(local_768.ray + 0x1c4) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1c4);
                    *(uint *)(local_768.ray + 0x1c8) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1c8);
                    *(uint *)(local_768.ray + 0x1cc) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1cc);
                    *(uint *)(local_768.ray + 0x1d0) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1d0);
                    *(uint *)(local_768.ray + 0x1d4) =
                         (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x1d4);
                    *(uint *)(local_768.ray + 0x1d8) =
                         (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1d8);
                    *(uint *)(local_768.ray + 0x1dc) =
                         (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1dc);
                    iVar1 = *(int *)(local_768.hit + 100);
                    iVar2 = *(int *)(local_768.hit + 0x68);
                    iVar81 = *(int *)(local_768.hit + 0x6c);
                    iVar82 = *(int *)(local_768.hit + 0x70);
                    iVar83 = *(int *)(local_768.hit + 0x74);
                    iVar84 = *(int *)(local_768.hit + 0x78);
                    iVar85 = *(int *)(local_768.hit + 0x7c);
                    bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                    bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                    bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                    bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                    bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                    bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                    bVar28 = SUB81(uVar30 >> 7,0);
                    *(uint *)(local_768.ray + 0x1e0) =
                         (uint)(bVar96 & 1) * *(int *)(local_768.hit + 0x60) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_768.ray + 0x1e0);
                    *(uint *)(local_768.ray + 0x1e4) =
                         (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1e4);
                    *(uint *)(local_768.ray + 0x1e8) =
                         (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1e8);
                    *(uint *)(local_768.ray + 0x1ec) =
                         (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1ec);
                    *(uint *)(local_768.ray + 0x1f0) =
                         (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1f0);
                    *(uint *)(local_768.ray + 500) =
                         (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 500);
                    *(uint *)(local_768.ray + 0x1f8) =
                         (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1f8);
                    *(uint *)(local_768.ray + 0x1fc) =
                         (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1fc);
                    auVar151._0_4_ =
                         (uint)(bVar96 & 1) * *(int *)(local_768.hit + 0x80) |
                         (uint)!(bool)(bVar96 & 1) * *(int *)(local_768.ray + 0x200);
                    bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                    auVar151._4_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x84) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x204);
                    bVar22 = (bool)((byte)(uVar30 >> 2) & 1);
                    auVar151._8_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x88) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x208);
                    bVar22 = (bool)((byte)(uVar30 >> 3) & 1);
                    auVar151._12_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x8c) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x20c);
                    bVar22 = (bool)((byte)(uVar30 >> 4) & 1);
                    auVar151._16_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x90) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x210);
                    bVar22 = (bool)((byte)(uVar30 >> 5) & 1);
                    auVar151._20_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x94) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x214);
                    bVar22 = (bool)((byte)(uVar30 >> 6) & 1);
                    auVar151._24_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x98) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x218);
                    bVar22 = SUB81(uVar30 >> 7,0);
                    auVar151._28_4_ =
                         (uint)bVar22 * *(int *)(local_768.hit + 0x9c) |
                         (uint)!bVar22 * *(int *)(local_768.ray + 0x21c);
                    *(undefined1 (*) [32])(local_768.ray + 0x200) = auVar151;
                    auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xa0));
                    *(undefined1 (*) [32])(local_768.ray + 0x220) = auVar115;
                    auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xc0));
                    *(undefined1 (*) [32])(local_768.ray + 0x240) = auVar115;
                    auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xe0));
                    *(undefined1 (*) [32])(local_768.ray + 0x260) = auVar115;
                    auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0x100));
                    *(undefined1 (*) [32])(local_768.ray + 0x280) = auVar115;
                  }
                  auVar120 = auVar234._0_32_;
                  bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar103;
                  uVar226 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar43._4_4_ = uVar226;
                  auVar43._0_4_ = uVar226;
                  auVar43._8_4_ = uVar226;
                  auVar43._12_4_ = uVar226;
                  auVar43._16_4_ = uVar226;
                  auVar43._20_4_ = uVar226;
                  auVar43._24_4_ = uVar226;
                  auVar43._28_4_ = uVar226;
                  uVar163 = vcmpps_avx512vl(local_6a0,auVar43,2);
                  bVar103 = bVar96 & (byte)uVar163;
                  if ((bVar96 & (byte)uVar163) != 0) {
                    auVar175._8_4_ = 0x7f800000;
                    auVar175._0_8_ = 0x7f8000007f800000;
                    auVar175._12_4_ = 0x7f800000;
                    auVar175._16_4_ = 0x7f800000;
                    auVar175._20_4_ = 0x7f800000;
                    auVar175._24_4_ = 0x7f800000;
                    auVar175._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar175,local_6a0);
                    auVar152._0_4_ =
                         (uint)(bVar103 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar103 & 1) * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 1 & 1);
                    auVar152._4_4_ = (uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 2 & 1);
                    auVar152._8_4_ = (uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 3 & 1);
                    auVar152._12_4_ = (uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 4 & 1);
                    auVar152._16_4_ = (uint)bVar22 * auVar115._16_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 5 & 1);
                    auVar152._20_4_ = (uint)bVar22 * auVar115._20_4_ | (uint)!bVar22 * 0x7f800000;
                    bVar22 = (bool)(bVar103 >> 6 & 1);
                    auVar152._24_4_ = (uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * 0x7f800000;
                    auVar152._28_4_ =
                         (uint)(bVar103 >> 7) * auVar115._28_4_ |
                         (uint)!(bool)(bVar103 >> 7) * 0x7f800000;
                    auVar115 = vshufps_avx(auVar152,auVar152,0xb1);
                    auVar115 = vminps_avx(auVar152,auVar115);
                    auVar114 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar114);
                    auVar114 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar114);
                    uVar163 = vcmpps_avx512vl(auVar152,auVar115,0);
                    bVar95 = (byte)uVar163 & bVar103;
                    bVar96 = bVar103;
                    if (bVar95 != 0) {
                      bVar96 = bVar95;
                    }
                    uVar31 = 0;
                    for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000
                        ) {
                      uVar31 = uVar31 + 1;
                    }
                    uVar97 = (ulong)uVar31;
                  }
                  uVar226 = auVar228._0_4_;
                } while (bVar103 != 0);
              }
            }
          }
        }
      }
      local_600 = uVar226;
      if (8 < iVar15) {
        auVar115 = vpbroadcastd_avx512vl();
        auVar228 = ZEXT3264(auVar115);
        local_340 = 1.0 / auVar218._0_4_;
        fStack_33c = local_340;
        fStack_338 = local_340;
        fStack_334 = local_340;
        fStack_330 = local_340;
        fStack_32c = local_340;
        fStack_328 = local_340;
        fStack_324 = local_340;
        local_360 = vpbroadcastd_avx512vl();
        local_380 = vpbroadcastd_avx512vl();
        lVar100 = 8;
        uStack_5fc = local_600;
        uStack_5f8 = local_600;
        uStack_5f4 = local_600;
        uStack_5f0 = local_600;
        uStack_5ec = local_600;
        uStack_5e8 = local_600;
        uStack_5e4 = local_600;
        local_5e0 = auVar120;
        local_4c0 = uVar162;
        uStack_4bc = uVar162;
        uStack_4b8 = uVar162;
        uStack_4b4 = uVar162;
        uStack_4b0 = uVar162;
        uStack_4ac = uVar162;
        uStack_4a8 = uVar162;
        uStack_4a4 = uVar162;
        do {
          auVar115 = vpbroadcastd_avx512vl();
          auVar116 = vpor_avx2(auVar115,_DAT_0205a920);
          uVar29 = vpcmpgtd_avx512vl(auVar228._0_32_,auVar116);
          auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar100 * 4 + lVar32);
          auVar114 = *(undefined1 (*) [32])(lVar32 + 0x2227768 + lVar100 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar32 + 0x2227bec + lVar100 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar32 + 0x2228070 + lVar100 * 4);
          local_520 = auVar242._0_32_;
          auVar117 = vmulps_avx512vl(local_520,auVar125);
          local_540 = auVar243._0_32_;
          auVar124 = vmulps_avx512vl(local_540,auVar125);
          auVar62._4_4_ = auVar125._4_4_ * (float)local_100._4_4_;
          auVar62._0_4_ = auVar125._0_4_ * (float)local_100._0_4_;
          auVar62._8_4_ = auVar125._8_4_ * fStack_f8;
          auVar62._12_4_ = auVar125._12_4_ * fStack_f4;
          auVar62._16_4_ = auVar125._16_4_ * fStack_f0;
          auVar62._20_4_ = auVar125._20_4_ * fStack_ec;
          auVar62._24_4_ = auVar125._24_4_ * fStack_e8;
          auVar62._28_4_ = auVar116._28_4_;
          auVar207 = auVar240._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar117,auVar126,auVar207);
          auVar210 = auVar241._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar124,auVar126,auVar210);
          auVar124 = vfmadd231ps_avx512vl(auVar62,auVar126,local_e0);
          auVar184 = auVar238._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar184);
          local_500 = auVar239._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,local_500);
          auVar106 = vfmadd231ps_fma(auVar124,auVar114,local_c0);
          auVar177 = auVar235._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar177);
          local_4e0 = auVar233._0_32_;
          auVar121 = vfmadd231ps_avx512vl(auVar117,auVar115,local_4e0);
          auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar100 * 4 + lVar32);
          auVar117 = *(undefined1 (*) [32])(lVar32 + 0x2229b88 + lVar100 * 4);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar115,local_a0);
          auVar124 = *(undefined1 (*) [32])(lVar32 + 0x222a00c + lVar100 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar32 + 0x222a490 + lVar100 * 4);
          auVar120 = vmulps_avx512vl(local_520,auVar118);
          auVar119 = vmulps_avx512vl(local_540,auVar118);
          auVar63._4_4_ = auVar118._4_4_ * (float)local_100._4_4_;
          auVar63._0_4_ = auVar118._0_4_ * (float)local_100._0_4_;
          auVar63._8_4_ = auVar118._8_4_ * fStack_f8;
          auVar63._12_4_ = auVar118._12_4_ * fStack_f4;
          auVar63._16_4_ = auVar118._16_4_ * fStack_f0;
          auVar63._20_4_ = auVar118._20_4_ * fStack_ec;
          auVar63._24_4_ = auVar118._24_4_ * fStack_e8;
          auVar63._28_4_ = uStack_e4;
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,auVar207);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar124,auVar210);
          auVar122 = vfmadd231ps_avx512vl(auVar63,auVar124,local_e0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar184);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar117,local_500);
          auVar107 = vfmadd231ps_fma(auVar122,auVar117,local_c0);
          auVar122 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar177);
          auVar111 = vfmadd231ps_avx512vl(auVar119,auVar116,local_4e0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar116,local_a0);
          auVar112 = vmaxps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar107));
          auVar120 = vsubps_avx(auVar122,auVar113);
          auVar119 = vsubps_avx(auVar111,auVar121);
          auVar123 = vmulps_avx512vl(auVar121,auVar120);
          auVar138 = vmulps_avx512vl(auVar113,auVar119);
          auVar123 = vsubps_avx512vl(auVar123,auVar138);
          auVar138 = vmulps_avx512vl(auVar119,auVar119);
          auVar138 = vfmadd231ps_avx512vl(auVar138,auVar120,auVar120);
          auVar112 = vmulps_avx512vl(auVar112,auVar112);
          auVar112 = vmulps_avx512vl(auVar112,auVar138);
          auVar123 = vmulps_avx512vl(auVar123,auVar123);
          uVar163 = vcmpps_avx512vl(auVar123,auVar112,2);
          local_3f0 = (byte)uVar29 & (byte)uVar163;
          if (local_3f0 == 0) {
            auVar234 = ZEXT3264(local_4e0);
          }
          else {
            auVar118 = vmulps_avx512vl(local_5e0,auVar118);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_160,auVar118);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar124);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_120,auVar117);
            auVar125 = vmulps_avx512vl(local_5e0,auVar125);
            auVar126 = vfmadd213ps_avx512vl(auVar126,local_160,auVar125);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_140,auVar126);
            auVar117 = vfmadd213ps_avx512vl(auVar115,local_120,auVar114);
            auVar115 = *(undefined1 (*) [32])(lVar32 + 0x22284f4 + lVar100 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar32 + 0x2228978 + lVar100 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar32 + 0x2228dfc + lVar100 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar32 + 0x2229280 + lVar100 * 4);
            auVar124 = vmulps_avx512vl(local_520,auVar125);
            auVar118 = vmulps_avx512vl(local_540,auVar125);
            auVar125 = vmulps_avx512vl(local_5e0,auVar125);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar126,auVar207);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar126,auVar210);
            auVar126 = vfmadd231ps_avx512vl(auVar125,local_160,auVar126);
            auVar125 = vfmadd231ps_avx512vl(auVar124,auVar114,auVar184);
            auVar124 = vfmadd231ps_avx512vl(auVar118,auVar114,local_500);
            auVar114 = vfmadd231ps_avx512vl(auVar126,local_140,auVar114);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar115,auVar177);
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar115,local_4e0);
            auVar118 = vfmadd231ps_avx512vl(auVar114,local_120,auVar115);
            auVar115 = *(undefined1 (*) [32])(lVar32 + 0x222a914 + lVar100 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar32 + 0x222b21c + lVar100 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar32 + 0x222b6a0 + lVar100 * 4);
            auVar112 = vmulps_avx512vl(local_520,auVar126);
            auVar123 = vmulps_avx512vl(local_540,auVar126);
            auVar126 = vmulps_avx512vl(local_5e0,auVar126);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar207);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,auVar210);
            auVar126 = vfmadd231ps_avx512vl(auVar126,local_160,auVar114);
            auVar114 = *(undefined1 (*) [32])(lVar32 + 0x222ad98 + lVar100 * 4);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar184);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar114,local_500);
            auVar114 = vfmadd231ps_avx512vl(auVar126,local_140,auVar114);
            auVar126 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar177);
            auVar112 = vfmadd231ps_avx512vl(auVar123,auVar115,local_4e0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_120,auVar115);
            auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar125,auVar123);
            vandps_avx512vl(auVar124,auVar123);
            auVar115 = vmaxps_avx(auVar123,auVar123);
            vandps_avx512vl(auVar118,auVar123);
            auVar115 = vmaxps_avx(auVar115,auVar123);
            auVar93._4_4_ = uStack_5fc;
            auVar93._0_4_ = local_600;
            auVar93._8_4_ = uStack_5f8;
            auVar93._12_4_ = uStack_5f4;
            auVar93._16_4_ = uStack_5f0;
            auVar93._20_4_ = uStack_5ec;
            auVar93._24_4_ = uStack_5e8;
            auVar93._28_4_ = uStack_5e4;
            uVar97 = vcmpps_avx512vl(auVar115,auVar93,1);
            bVar22 = (bool)((byte)uVar97 & 1);
            auVar139._0_4_ = (float)((uint)bVar22 * auVar120._0_4_ | (uint)!bVar22 * auVar125._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar22 * auVar120._4_4_ | (uint)!bVar22 * auVar125._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar22 * auVar120._8_4_ | (uint)!bVar22 * auVar125._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar22 * auVar120._12_4_ | (uint)!bVar22 * auVar125._12_4_);
            bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar22 * auVar120._16_4_ | (uint)!bVar22 * auVar125._16_4_);
            bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar22 * auVar120._20_4_ | (uint)!bVar22 * auVar125._20_4_);
            bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar22 * auVar120._24_4_ | (uint)!bVar22 * auVar125._24_4_);
            bVar22 = SUB81(uVar97 >> 7,0);
            auVar139._28_4_ = (uint)bVar22 * auVar120._28_4_ | (uint)!bVar22 * auVar125._28_4_;
            bVar22 = (bool)((byte)uVar97 & 1);
            auVar140._0_4_ = (float)((uint)bVar22 * auVar119._0_4_ | (uint)!bVar22 * auVar124._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar22 * auVar119._4_4_ | (uint)!bVar22 * auVar124._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar22 * auVar119._8_4_ | (uint)!bVar22 * auVar124._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar22 * auVar119._12_4_ | (uint)!bVar22 * auVar124._12_4_);
            bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar140._16_4_ =
                 (float)((uint)bVar22 * auVar119._16_4_ | (uint)!bVar22 * auVar124._16_4_);
            bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar140._20_4_ =
                 (float)((uint)bVar22 * auVar119._20_4_ | (uint)!bVar22 * auVar124._20_4_);
            bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar140._24_4_ =
                 (float)((uint)bVar22 * auVar119._24_4_ | (uint)!bVar22 * auVar124._24_4_);
            bVar22 = SUB81(uVar97 >> 7,0);
            auVar140._28_4_ = (uint)bVar22 * auVar119._28_4_ | (uint)!bVar22 * auVar124._28_4_;
            vandps_avx512vl(auVar126,auVar123);
            vandps_avx512vl(auVar112,auVar123);
            auVar115 = vmaxps_avx(auVar140,auVar140);
            vandps_avx512vl(auVar114,auVar123);
            auVar115 = vmaxps_avx(auVar115,auVar140);
            uVar97 = vcmpps_avx512vl(auVar115,auVar93,1);
            bVar22 = (bool)((byte)uVar97 & 1);
            auVar141._0_4_ = (uint)bVar22 * auVar120._0_4_ | (uint)!bVar22 * auVar126._0_4_;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar22 * auVar120._4_4_ | (uint)!bVar22 * auVar126._4_4_;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar22 * auVar120._8_4_ | (uint)!bVar22 * auVar126._8_4_;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar22 * auVar120._12_4_ | (uint)!bVar22 * auVar126._12_4_;
            bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar22 * auVar120._16_4_ | (uint)!bVar22 * auVar126._16_4_;
            bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar22 * auVar120._20_4_ | (uint)!bVar22 * auVar126._20_4_;
            bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar22 * auVar120._24_4_ | (uint)!bVar22 * auVar126._24_4_;
            bVar22 = SUB81(uVar97 >> 7,0);
            auVar141._28_4_ = (uint)bVar22 * auVar120._28_4_ | (uint)!bVar22 * auVar126._28_4_;
            bVar22 = (bool)((byte)uVar97 & 1);
            auVar142._0_4_ = (float)((uint)bVar22 * auVar119._0_4_ | (uint)!bVar22 * auVar112._0_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar22 * auVar119._4_4_ | (uint)!bVar22 * auVar112._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar22 * auVar119._8_4_ | (uint)!bVar22 * auVar112._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar22 * auVar119._12_4_ | (uint)!bVar22 * auVar112._12_4_);
            bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar22 * auVar119._16_4_ | (uint)!bVar22 * auVar112._16_4_);
            bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar22 * auVar119._20_4_ | (uint)!bVar22 * auVar112._20_4_);
            bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar22 * auVar119._24_4_ | (uint)!bVar22 * auVar112._24_4_);
            bVar22 = SUB81(uVar97 >> 7,0);
            auVar142._28_4_ = (uint)bVar22 * auVar119._28_4_ | (uint)!bVar22 * auVar112._28_4_;
            auVar220._8_4_ = 0x80000000;
            auVar220._0_8_ = 0x8000000080000000;
            auVar220._12_4_ = 0x80000000;
            auVar220._16_4_ = 0x80000000;
            auVar220._20_4_ = 0x80000000;
            auVar220._24_4_ = 0x80000000;
            auVar220._28_4_ = 0x80000000;
            auVar115 = vxorps_avx512vl(auVar141,auVar220);
            auVar112 = auVar237._0_32_;
            auVar114 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar112);
            auVar236 = vfmadd231ps_fma(auVar114,auVar140,auVar140);
            auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar236));
            auVar232._8_4_ = 0xbf000000;
            auVar232._0_8_ = 0xbf000000bf000000;
            auVar232._12_4_ = 0xbf000000;
            auVar232._16_4_ = 0xbf000000;
            auVar232._20_4_ = 0xbf000000;
            auVar232._24_4_ = 0xbf000000;
            auVar232._28_4_ = 0xbf000000;
            fVar194 = auVar114._0_4_;
            fVar161 = auVar114._4_4_;
            fVar201 = auVar114._8_4_;
            fVar202 = auVar114._12_4_;
            fVar186 = auVar114._16_4_;
            fVar193 = auVar114._20_4_;
            fVar104 = auVar114._24_4_;
            auVar64._4_4_ = fVar161 * fVar161 * fVar161 * auVar236._4_4_ * -0.5;
            auVar64._0_4_ = fVar194 * fVar194 * fVar194 * auVar236._0_4_ * -0.5;
            auVar64._8_4_ = fVar201 * fVar201 * fVar201 * auVar236._8_4_ * -0.5;
            auVar64._12_4_ = fVar202 * fVar202 * fVar202 * auVar236._12_4_ * -0.5;
            auVar64._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
            auVar64._20_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar64._24_4_ = fVar104 * fVar104 * fVar104 * -0.0;
            auVar64._28_4_ = auVar140._28_4_;
            auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar114 = vfmadd231ps_avx512vl(auVar64,auVar126,auVar114);
            auVar65._4_4_ = auVar140._4_4_ * auVar114._4_4_;
            auVar65._0_4_ = auVar140._0_4_ * auVar114._0_4_;
            auVar65._8_4_ = auVar140._8_4_ * auVar114._8_4_;
            auVar65._12_4_ = auVar140._12_4_ * auVar114._12_4_;
            auVar65._16_4_ = auVar140._16_4_ * auVar114._16_4_;
            auVar65._20_4_ = auVar140._20_4_ * auVar114._20_4_;
            auVar65._24_4_ = auVar140._24_4_ * auVar114._24_4_;
            auVar65._28_4_ = 0;
            auVar66._4_4_ = auVar114._4_4_ * -auVar139._4_4_;
            auVar66._0_4_ = auVar114._0_4_ * -auVar139._0_4_;
            auVar66._8_4_ = auVar114._8_4_ * -auVar139._8_4_;
            auVar66._12_4_ = auVar114._12_4_ * -auVar139._12_4_;
            auVar66._16_4_ = auVar114._16_4_ * -auVar139._16_4_;
            auVar66._20_4_ = auVar114._20_4_ * -auVar139._20_4_;
            auVar66._24_4_ = auVar114._24_4_ * -auVar139._24_4_;
            auVar66._28_4_ = auVar140._28_4_;
            auVar125 = vmulps_avx512vl(auVar114,auVar112);
            auVar114 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar112);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar142,auVar142);
            auVar124 = vrsqrt14ps_avx512vl(auVar114);
            auVar114 = vmulps_avx512vl(auVar114,auVar232);
            fVar194 = auVar124._0_4_;
            fVar161 = auVar124._4_4_;
            fVar201 = auVar124._8_4_;
            fVar202 = auVar124._12_4_;
            fVar186 = auVar124._16_4_;
            fVar193 = auVar124._20_4_;
            fVar104 = auVar124._24_4_;
            auVar67._4_4_ = fVar161 * fVar161 * fVar161 * auVar114._4_4_;
            auVar67._0_4_ = fVar194 * fVar194 * fVar194 * auVar114._0_4_;
            auVar67._8_4_ = fVar201 * fVar201 * fVar201 * auVar114._8_4_;
            auVar67._12_4_ = fVar202 * fVar202 * fVar202 * auVar114._12_4_;
            auVar67._16_4_ = fVar186 * fVar186 * fVar186 * auVar114._16_4_;
            auVar67._20_4_ = fVar193 * fVar193 * fVar193 * auVar114._20_4_;
            auVar67._24_4_ = fVar104 * fVar104 * fVar104 * auVar114._24_4_;
            auVar67._28_4_ = auVar114._28_4_;
            auVar114 = vfmadd231ps_avx512vl(auVar67,auVar126,auVar124);
            auVar68._4_4_ = auVar142._4_4_ * auVar114._4_4_;
            auVar68._0_4_ = auVar142._0_4_ * auVar114._0_4_;
            auVar68._8_4_ = auVar142._8_4_ * auVar114._8_4_;
            auVar68._12_4_ = auVar142._12_4_ * auVar114._12_4_;
            auVar68._16_4_ = auVar142._16_4_ * auVar114._16_4_;
            auVar68._20_4_ = auVar142._20_4_ * auVar114._20_4_;
            auVar68._24_4_ = auVar142._24_4_ * auVar114._24_4_;
            auVar68._28_4_ = auVar124._28_4_;
            auVar69._4_4_ = auVar114._4_4_ * auVar115._4_4_;
            auVar69._0_4_ = auVar114._0_4_ * auVar115._0_4_;
            auVar69._8_4_ = auVar114._8_4_ * auVar115._8_4_;
            auVar69._12_4_ = auVar114._12_4_ * auVar115._12_4_;
            auVar69._16_4_ = auVar114._16_4_ * auVar115._16_4_;
            auVar69._20_4_ = auVar114._20_4_ * auVar115._20_4_;
            auVar69._24_4_ = auVar114._24_4_ * auVar115._24_4_;
            auVar69._28_4_ = auVar115._28_4_;
            auVar115 = vmulps_avx512vl(auVar114,auVar112);
            auVar236 = vfmadd213ps_fma(auVar65,ZEXT1632(auVar106),auVar113);
            auVar114 = ZEXT1632(auVar106);
            auVar8 = vfmadd213ps_fma(auVar66,auVar114,auVar121);
            auVar126 = vfmadd213ps_avx512vl(auVar125,auVar114,auVar117);
            auVar124 = vfmadd213ps_avx512vl(auVar68,ZEXT1632(auVar107),auVar122);
            auVar164 = vfnmadd213ps_fma(auVar65,auVar114,auVar113);
            auVar118 = ZEXT1632(auVar107);
            auVar9 = vfmadd213ps_fma(auVar69,auVar118,auVar111);
            auVar108 = vfnmadd213ps_fma(auVar66,auVar114,auVar121);
            auVar10 = vfmadd213ps_fma(auVar115,auVar118,auVar116);
            auVar121 = ZEXT1632(auVar106);
            auVar110 = vfnmadd231ps_fma(auVar117,auVar121,auVar125);
            auVar109 = vfnmadd213ps_fma(auVar68,auVar118,auVar122);
            auVar176 = vfnmadd213ps_fma(auVar69,auVar118,auVar111);
            auVar178 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar107),auVar115);
            auVar116 = vsubps_avx512vl(auVar124,ZEXT1632(auVar164));
            auVar115 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar108));
            auVar114 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar110));
            auVar70._4_4_ = auVar115._4_4_ * auVar110._4_4_;
            auVar70._0_4_ = auVar115._0_4_ * auVar110._0_4_;
            auVar70._8_4_ = auVar115._8_4_ * auVar110._8_4_;
            auVar70._12_4_ = auVar115._12_4_ * auVar110._12_4_;
            auVar70._16_4_ = auVar115._16_4_ * 0.0;
            auVar70._20_4_ = auVar115._20_4_ * 0.0;
            auVar70._24_4_ = auVar115._24_4_ * 0.0;
            auVar70._28_4_ = auVar125._28_4_;
            auVar106 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar108),auVar114);
            auVar71._4_4_ = auVar114._4_4_ * auVar164._4_4_;
            auVar71._0_4_ = auVar114._0_4_ * auVar164._0_4_;
            auVar71._8_4_ = auVar114._8_4_ * auVar164._8_4_;
            auVar71._12_4_ = auVar114._12_4_ * auVar164._12_4_;
            auVar71._16_4_ = auVar114._16_4_ * 0.0;
            auVar71._20_4_ = auVar114._20_4_ * 0.0;
            auVar71._24_4_ = auVar114._24_4_ * 0.0;
            auVar71._28_4_ = auVar114._28_4_;
            auVar11 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar110),auVar116);
            auVar72._4_4_ = auVar108._4_4_ * auVar116._4_4_;
            auVar72._0_4_ = auVar108._0_4_ * auVar116._0_4_;
            auVar72._8_4_ = auVar108._8_4_ * auVar116._8_4_;
            auVar72._12_4_ = auVar108._12_4_ * auVar116._12_4_;
            auVar72._16_4_ = auVar116._16_4_ * 0.0;
            auVar72._20_4_ = auVar116._20_4_ * 0.0;
            auVar72._24_4_ = auVar116._24_4_ * 0.0;
            auVar72._28_4_ = auVar116._28_4_;
            auVar12 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar164),auVar115);
            auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar12),auVar112,ZEXT1632(auVar11));
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,ZEXT1632(auVar106));
            uVar97 = vcmpps_avx512vl(auVar115,auVar112,2);
            bVar103 = (byte)uVar97;
            fVar185 = (float)((uint)(bVar103 & 1) * auVar236._0_4_ |
                             (uint)!(bool)(bVar103 & 1) * auVar109._0_4_);
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar155 = (float)((uint)bVar22 * auVar236._4_4_ | (uint)!bVar22 * auVar109._4_4_);
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar158 = (float)((uint)bVar22 * auVar236._8_4_ | (uint)!bVar22 * auVar109._8_4_);
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar159 = (float)((uint)bVar22 * auVar236._12_4_ | (uint)!bVar22 * auVar109._12_4_);
            auVar118 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar158,CONCAT44(fVar155,fVar185))));
            fVar154 = (float)((uint)(bVar103 & 1) * auVar8._0_4_ |
                             (uint)!(bool)(bVar103 & 1) * auVar176._0_4_);
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            fVar157 = (float)((uint)bVar22 * auVar8._4_4_ | (uint)!bVar22 * auVar176._4_4_);
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            fVar156 = (float)((uint)bVar22 * auVar8._8_4_ | (uint)!bVar22 * auVar176._8_4_);
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            fVar160 = (float)((uint)bVar22 * auVar8._12_4_ | (uint)!bVar22 * auVar176._12_4_);
            auVar120 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar156,CONCAT44(fVar157,fVar154))));
            auVar143._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar126._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar178._0_4_);
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar22 * auVar126._4_4_ | (uint)!bVar22 * auVar178._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar22 * auVar126._8_4_ | (uint)!bVar22 * auVar178._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar22 * auVar126._12_4_ | (uint)!bVar22 * auVar178._12_4_);
            fVar194 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar126._16_4_);
            auVar143._16_4_ = fVar194;
            fVar161 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar126._20_4_);
            auVar143._20_4_ = fVar161;
            fVar201 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar126._24_4_);
            auVar143._24_4_ = fVar201;
            iVar1 = (uint)(byte)(uVar97 >> 7) * auVar126._28_4_;
            auVar143._28_4_ = iVar1;
            auVar115 = vblendmps_avx512vl(ZEXT1632(auVar164),auVar124);
            auVar144._0_4_ =
                 (uint)(bVar103 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar103 & 1) * auVar106._0_4_;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * auVar106._4_4_;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * auVar106._8_4_;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * auVar106._12_4_;
            auVar144._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * auVar115._16_4_;
            auVar144._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * auVar115._20_4_;
            auVar144._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * auVar115._24_4_;
            auVar144._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar115._28_4_;
            auVar115 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar9));
            auVar145._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar236._0_4_);
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * auVar236._4_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * auVar236._8_4_)
            ;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * auVar236._12_4_);
            fVar193 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar115._16_4_);
            auVar145._16_4_ = fVar193;
            fVar186 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar115._20_4_);
            auVar145._20_4_ = fVar186;
            fVar202 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar115._24_4_);
            auVar145._24_4_ = fVar202;
            auVar145._28_4_ = (uint)(byte)(uVar97 >> 7) * auVar115._28_4_;
            auVar115 = vblendmps_avx512vl(ZEXT1632(auVar110),ZEXT1632(auVar10));
            auVar146._0_4_ =
                 (float)((uint)(bVar103 & 1) * auVar115._0_4_ |
                        (uint)!(bool)(bVar103 & 1) * auVar8._0_4_);
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * auVar8._4_4_);
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * auVar8._8_4_);
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * auVar8._12_4_);
            fVar153 = (float)((uint)((byte)(uVar97 >> 4) & 1) * auVar115._16_4_);
            auVar146._16_4_ = fVar153;
            fVar104 = (float)((uint)((byte)(uVar97 >> 5) & 1) * auVar115._20_4_);
            auVar146._20_4_ = fVar104;
            fVar105 = (float)((uint)((byte)(uVar97 >> 6) & 1) * auVar115._24_4_);
            auVar146._24_4_ = fVar105;
            iVar2 = (uint)(byte)(uVar97 >> 7) * auVar115._28_4_;
            auVar146._28_4_ = iVar2;
            auVar147._0_4_ =
                 (uint)(bVar103 & 1) * (int)auVar164._0_4_ |
                 (uint)!(bool)(bVar103 & 1) * auVar124._0_4_;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar22 * (int)auVar164._4_4_ | (uint)!bVar22 * auVar124._4_4_;
            bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar22 * (int)auVar164._8_4_ | (uint)!bVar22 * auVar124._8_4_;
            bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar22 * (int)auVar164._12_4_ | (uint)!bVar22 * auVar124._12_4_;
            auVar147._16_4_ = (uint)!(bool)((byte)(uVar97 >> 4) & 1) * auVar124._16_4_;
            auVar147._20_4_ = (uint)!(bool)((byte)(uVar97 >> 5) & 1) * auVar124._20_4_;
            auVar147._24_4_ = (uint)!(bool)((byte)(uVar97 >> 6) & 1) * auVar124._24_4_;
            auVar147._28_4_ = (uint)!SUB81(uVar97 >> 7,0) * auVar124._28_4_;
            bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar24 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar26 = (bool)((byte)(uVar97 >> 3) & 1);
            bVar23 = (bool)((byte)(uVar97 >> 1) & 1);
            bVar25 = (bool)((byte)(uVar97 >> 2) & 1);
            bVar27 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar124 = vsubps_avx512vl(auVar147,auVar118);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar26 * (int)auVar108._12_4_ |
                                                     (uint)!bVar26 * auVar9._12_4_,
                                                     CONCAT48((uint)bVar24 * (int)auVar108._8_4_ |
                                                              (uint)!bVar24 * auVar9._8_4_,
                                                              CONCAT44((uint)bVar22 *
                                                                       (int)auVar108._4_4_ |
                                                                       (uint)!bVar22 * auVar9._4_4_,
                                                                       (uint)(bVar103 & 1) *
                                                                       (int)auVar108._0_4_ |
                                                                       (uint)!(bool)(bVar103 & 1) *
                                                                       auVar9._0_4_)))),auVar120);
            auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar27 * (int)auVar110._12_4_ |
                                                     (uint)!bVar27 * auVar10._12_4_,
                                                     CONCAT48((uint)bVar25 * (int)auVar110._8_4_ |
                                                              (uint)!bVar25 * auVar10._8_4_,
                                                              CONCAT44((uint)bVar23 *
                                                                       (int)auVar110._4_4_ |
                                                                       (uint)!bVar23 * auVar10._4_4_
                                                                       ,(uint)(bVar103 & 1) *
                                                                        (int)auVar110._0_4_ |
                                                                        (uint)!(bool)(bVar103 & 1) *
                                                                        auVar10._0_4_)))),auVar143);
            auVar125 = vsubps_avx(auVar118,auVar144);
            auVar116 = vsubps_avx(auVar120,auVar145);
            auVar117 = vsubps_avx(auVar143,auVar146);
            auVar73._4_4_ = auVar126._4_4_ * fVar155;
            auVar73._0_4_ = auVar126._0_4_ * fVar185;
            auVar73._8_4_ = auVar126._8_4_ * fVar158;
            auVar73._12_4_ = auVar126._12_4_ * fVar159;
            auVar73._16_4_ = auVar126._16_4_ * 0.0;
            auVar73._20_4_ = auVar126._20_4_ * 0.0;
            auVar73._24_4_ = auVar126._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar73,auVar143,auVar124);
            auVar192._0_4_ = fVar154 * auVar124._0_4_;
            auVar192._4_4_ = fVar157 * auVar124._4_4_;
            auVar192._8_4_ = fVar156 * auVar124._8_4_;
            auVar192._12_4_ = fVar160 * auVar124._12_4_;
            auVar192._16_4_ = auVar124._16_4_ * 0.0;
            auVar192._20_4_ = auVar124._20_4_ * 0.0;
            auVar192._24_4_ = auVar124._24_4_ * 0.0;
            auVar192._28_4_ = 0;
            auVar236 = vfmsub231ps_fma(auVar192,auVar118,auVar114);
            auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar236),auVar112,ZEXT1632(auVar106));
            auVar197._0_4_ = auVar114._0_4_ * auVar143._0_4_;
            auVar197._4_4_ = auVar114._4_4_ * auVar143._4_4_;
            auVar197._8_4_ = auVar114._8_4_ * auVar143._8_4_;
            auVar197._12_4_ = auVar114._12_4_ * auVar143._12_4_;
            auVar197._16_4_ = auVar114._16_4_ * fVar194;
            auVar197._20_4_ = auVar114._20_4_ * fVar161;
            auVar197._24_4_ = auVar114._24_4_ * fVar201;
            auVar197._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar197,auVar120,auVar126);
            auVar119 = vfmadd231ps_avx512vl(auVar115,auVar112,ZEXT1632(auVar106));
            auVar115 = vmulps_avx512vl(auVar117,auVar144);
            auVar115 = vfmsub231ps_avx512vl(auVar115,auVar125,auVar146);
            auVar74._4_4_ = auVar116._4_4_ * auVar146._4_4_;
            auVar74._0_4_ = auVar116._0_4_ * auVar146._0_4_;
            auVar74._8_4_ = auVar116._8_4_ * auVar146._8_4_;
            auVar74._12_4_ = auVar116._12_4_ * auVar146._12_4_;
            auVar74._16_4_ = auVar116._16_4_ * fVar153;
            auVar74._20_4_ = auVar116._20_4_ * fVar104;
            auVar74._24_4_ = auVar116._24_4_ * fVar105;
            auVar74._28_4_ = iVar2;
            auVar106 = vfmsub231ps_fma(auVar74,auVar145,auVar117);
            auVar198._0_4_ = auVar145._0_4_ * auVar125._0_4_;
            auVar198._4_4_ = auVar145._4_4_ * auVar125._4_4_;
            auVar198._8_4_ = auVar145._8_4_ * auVar125._8_4_;
            auVar198._12_4_ = auVar145._12_4_ * auVar125._12_4_;
            auVar198._16_4_ = fVar193 * auVar125._16_4_;
            auVar198._20_4_ = fVar186 * auVar125._20_4_;
            auVar198._24_4_ = fVar202 * auVar125._24_4_;
            auVar198._28_4_ = 0;
            auVar236 = vfmsub231ps_fma(auVar198,auVar116,auVar144);
            auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar236),auVar112,auVar115);
            auVar113 = vfmadd231ps_avx512vl(auVar115,auVar112,ZEXT1632(auVar106));
            auVar115 = vmaxps_avx(auVar119,auVar113);
            uVar163 = vcmpps_avx512vl(auVar115,auVar112,2);
            local_3f0 = local_3f0 & (byte)uVar163;
            if (local_3f0 == 0) {
LAB_01eea2fb:
              local_3f0 = 0;
            }
            else {
              auVar75._4_4_ = auVar117._4_4_ * auVar114._4_4_;
              auVar75._0_4_ = auVar117._0_4_ * auVar114._0_4_;
              auVar75._8_4_ = auVar117._8_4_ * auVar114._8_4_;
              auVar75._12_4_ = auVar117._12_4_ * auVar114._12_4_;
              auVar75._16_4_ = auVar117._16_4_ * auVar114._16_4_;
              auVar75._20_4_ = auVar117._20_4_ * auVar114._20_4_;
              auVar75._24_4_ = auVar117._24_4_ * auVar114._24_4_;
              auVar75._28_4_ = auVar115._28_4_;
              auVar8 = vfmsub231ps_fma(auVar75,auVar116,auVar126);
              auVar76._4_4_ = auVar126._4_4_ * auVar125._4_4_;
              auVar76._0_4_ = auVar126._0_4_ * auVar125._0_4_;
              auVar76._8_4_ = auVar126._8_4_ * auVar125._8_4_;
              auVar76._12_4_ = auVar126._12_4_ * auVar125._12_4_;
              auVar76._16_4_ = auVar126._16_4_ * auVar125._16_4_;
              auVar76._20_4_ = auVar126._20_4_ * auVar125._20_4_;
              auVar76._24_4_ = auVar126._24_4_ * auVar125._24_4_;
              auVar76._28_4_ = auVar126._28_4_;
              auVar236 = vfmsub231ps_fma(auVar76,auVar124,auVar117);
              auVar77._4_4_ = auVar116._4_4_ * auVar124._4_4_;
              auVar77._0_4_ = auVar116._0_4_ * auVar124._0_4_;
              auVar77._8_4_ = auVar116._8_4_ * auVar124._8_4_;
              auVar77._12_4_ = auVar116._12_4_ * auVar124._12_4_;
              auVar77._16_4_ = auVar116._16_4_ * auVar124._16_4_;
              auVar77._20_4_ = auVar116._20_4_ * auVar124._20_4_;
              auVar77._24_4_ = auVar116._24_4_ * auVar124._24_4_;
              auVar77._28_4_ = auVar116._28_4_;
              auVar9 = vfmsub231ps_fma(auVar77,auVar125,auVar114);
              auVar106 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar236),ZEXT1632(auVar9));
              auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar8),auVar112);
              auVar114 = vrcp14ps_avx512vl(auVar115);
              auVar38._8_4_ = 0x3f800000;
              auVar38._0_8_ = &DAT_3f8000003f800000;
              auVar38._12_4_ = 0x3f800000;
              auVar38._16_4_ = 0x3f800000;
              auVar38._20_4_ = 0x3f800000;
              auVar38._24_4_ = 0x3f800000;
              auVar38._28_4_ = 0x3f800000;
              auVar126 = vfnmadd213ps_avx512vl(auVar114,auVar115,auVar38);
              auVar106 = vfmadd132ps_fma(auVar126,auVar114,auVar114);
              auVar78._4_4_ = auVar9._4_4_ * auVar143._4_4_;
              auVar78._0_4_ = auVar9._0_4_ * auVar143._0_4_;
              auVar78._8_4_ = auVar9._8_4_ * auVar143._8_4_;
              auVar78._12_4_ = auVar9._12_4_ * auVar143._12_4_;
              auVar78._16_4_ = fVar194 * 0.0;
              auVar78._20_4_ = fVar161 * 0.0;
              auVar78._24_4_ = fVar201 * 0.0;
              auVar78._28_4_ = iVar1;
              auVar236 = vfmadd231ps_fma(auVar78,auVar120,ZEXT1632(auVar236));
              auVar236 = vfmadd231ps_fma(ZEXT1632(auVar236),auVar118,ZEXT1632(auVar8));
              fVar194 = auVar106._0_4_;
              fVar161 = auVar106._4_4_;
              fVar201 = auVar106._8_4_;
              fVar202 = auVar106._12_4_;
              auVar114 = ZEXT1632(CONCAT412(auVar236._12_4_ * fVar202,
                                            CONCAT48(auVar236._8_4_ * fVar201,
                                                     CONCAT44(auVar236._4_4_ * fVar161,
                                                              auVar236._0_4_ * fVar194))));
              auVar94._4_4_ = uStack_4bc;
              auVar94._0_4_ = local_4c0;
              auVar94._8_4_ = uStack_4b8;
              auVar94._12_4_ = uStack_4b4;
              auVar94._16_4_ = uStack_4b0;
              auVar94._20_4_ = uStack_4ac;
              auVar94._24_4_ = uStack_4a8;
              auVar94._28_4_ = uStack_4a4;
              uVar163 = vcmpps_avx512vl(auVar114,auVar94,0xd);
              uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar39._4_4_ = uVar162;
              auVar39._0_4_ = uVar162;
              auVar39._8_4_ = uVar162;
              auVar39._12_4_ = uVar162;
              auVar39._16_4_ = uVar162;
              auVar39._20_4_ = uVar162;
              auVar39._24_4_ = uVar162;
              auVar39._28_4_ = uVar162;
              uVar29 = vcmpps_avx512vl(auVar114,auVar39,2);
              local_3f0 = (byte)uVar163 & (byte)uVar29 & local_3f0;
              if (local_3f0 == 0) goto LAB_01eea2fb;
              uVar163 = vcmpps_avx512vl(auVar115,auVar112,4);
              if ((local_3f0 & (byte)uVar163) == 0) {
                local_3f0 = 0;
              }
              else {
                local_3f0 = local_3f0 & (byte)uVar163;
                fVar186 = auVar119._0_4_ * fVar194;
                fVar193 = auVar119._4_4_ * fVar161;
                auVar79._4_4_ = fVar193;
                auVar79._0_4_ = fVar186;
                fVar104 = auVar119._8_4_ * fVar201;
                auVar79._8_4_ = fVar104;
                fVar105 = auVar119._12_4_ * fVar202;
                auVar79._12_4_ = fVar105;
                fVar153 = auVar119._16_4_ * 0.0;
                auVar79._16_4_ = fVar153;
                fVar185 = auVar119._20_4_ * 0.0;
                auVar79._20_4_ = fVar185;
                fVar154 = auVar119._24_4_ * 0.0;
                auVar79._24_4_ = fVar154;
                auVar79._28_4_ = auVar119._28_4_;
                fVar194 = auVar113._0_4_ * fVar194;
                fVar161 = auVar113._4_4_ * fVar161;
                auVar80._4_4_ = fVar161;
                auVar80._0_4_ = fVar194;
                fVar201 = auVar113._8_4_ * fVar201;
                auVar80._8_4_ = fVar201;
                fVar202 = auVar113._12_4_ * fVar202;
                auVar80._12_4_ = fVar202;
                fVar155 = auVar113._16_4_ * 0.0;
                auVar80._16_4_ = fVar155;
                fVar157 = auVar113._20_4_ * 0.0;
                auVar80._20_4_ = fVar157;
                fVar158 = auVar113._24_4_ * 0.0;
                auVar80._24_4_ = fVar158;
                auVar80._28_4_ = auVar113._28_4_;
                auVar212._8_4_ = 0x3f800000;
                auVar212._0_8_ = &DAT_3f8000003f800000;
                auVar212._12_4_ = 0x3f800000;
                auVar212._16_4_ = 0x3f800000;
                auVar212._20_4_ = 0x3f800000;
                auVar212._24_4_ = 0x3f800000;
                auVar212._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar212,auVar79);
                local_6c0._0_4_ =
                     (uint)(bVar103 & 1) * (int)fVar186 |
                     (uint)!(bool)(bVar103 & 1) * auVar115._0_4_;
                bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
                local_6c0._4_4_ = (uint)bVar22 * (int)fVar193 | (uint)!bVar22 * auVar115._4_4_;
                bVar22 = (bool)((byte)(uVar97 >> 2) & 1);
                local_6c0._8_4_ = (uint)bVar22 * (int)fVar104 | (uint)!bVar22 * auVar115._8_4_;
                bVar22 = (bool)((byte)(uVar97 >> 3) & 1);
                local_6c0._12_4_ = (uint)bVar22 * (int)fVar105 | (uint)!bVar22 * auVar115._12_4_;
                bVar22 = (bool)((byte)(uVar97 >> 4) & 1);
                local_6c0._16_4_ = (uint)bVar22 * (int)fVar153 | (uint)!bVar22 * auVar115._16_4_;
                bVar22 = (bool)((byte)(uVar97 >> 5) & 1);
                local_6c0._20_4_ = (uint)bVar22 * (int)fVar185 | (uint)!bVar22 * auVar115._20_4_;
                bVar22 = (bool)((byte)(uVar97 >> 6) & 1);
                local_6c0._24_4_ = (uint)bVar22 * (int)fVar154 | (uint)!bVar22 * auVar115._24_4_;
                bVar22 = SUB81(uVar97 >> 7,0);
                local_6c0._28_4_ = (uint)bVar22 * auVar119._28_4_ | (uint)!bVar22 * auVar115._28_4_;
                auVar115 = vsubps_avx(auVar212,auVar80);
                bVar22 = (bool)((byte)(uVar97 >> 1) & 1);
                bVar23 = (bool)((byte)(uVar97 >> 2) & 1);
                bVar24 = (bool)((byte)(uVar97 >> 3) & 1);
                bVar25 = (bool)((byte)(uVar97 >> 4) & 1);
                bVar26 = (bool)((byte)(uVar97 >> 5) & 1);
                bVar27 = (bool)((byte)(uVar97 >> 6) & 1);
                bVar28 = SUB81(uVar97 >> 7,0);
                local_320._4_4_ = (uint)bVar22 * (int)fVar161 | (uint)!bVar22 * auVar115._4_4_;
                local_320._0_4_ =
                     (uint)(bVar103 & 1) * (int)fVar194 |
                     (uint)!(bool)(bVar103 & 1) * auVar115._0_4_;
                local_320._8_4_ = (uint)bVar23 * (int)fVar201 | (uint)!bVar23 * auVar115._8_4_;
                local_320._12_4_ = (uint)bVar24 * (int)fVar202 | (uint)!bVar24 * auVar115._12_4_;
                local_320._16_4_ = (uint)bVar25 * (int)fVar155 | (uint)!bVar25 * auVar115._16_4_;
                local_320._20_4_ = (uint)bVar26 * (int)fVar157 | (uint)!bVar26 * auVar115._20_4_;
                local_320._24_4_ = (uint)bVar27 * (int)fVar158 | (uint)!bVar27 * auVar115._24_4_;
                local_320._28_4_ = (uint)bVar28 * auVar113._28_4_ | (uint)!bVar28 * auVar115._28_4_;
                local_6e0 = auVar114;
              }
            }
            auVar234 = ZEXT3264(local_4e0);
            if (local_3f0 != 0) {
              auVar115 = vsubps_avx(ZEXT1632(auVar107),auVar121);
              auVar106 = vfmadd213ps_fma(auVar115,local_6c0,auVar121);
              uVar162 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar40._4_4_ = uVar162;
              auVar40._0_4_ = uVar162;
              auVar40._8_4_ = uVar162;
              auVar40._12_4_ = uVar162;
              auVar40._16_4_ = uVar162;
              auVar40._20_4_ = uVar162;
              auVar40._24_4_ = uVar162;
              auVar40._28_4_ = uVar162;
              auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar106._12_4_ + auVar106._12_4_,
                                                            CONCAT48(auVar106._8_4_ + auVar106._8_4_
                                                                     ,CONCAT44(auVar106._4_4_ +
                                                                               auVar106._4_4_,
                                                                               auVar106._0_4_ +
                                                                               auVar106._0_4_)))),
                                         auVar40);
              uVar163 = vcmpps_avx512vl(local_6e0,auVar115,6);
              local_3f0 = local_3f0 & (byte)uVar163;
              if (local_3f0 != 0) {
                auVar172._8_4_ = 0xbf800000;
                auVar172._0_8_ = 0xbf800000bf800000;
                auVar172._12_4_ = 0xbf800000;
                auVar172._16_4_ = 0xbf800000;
                auVar172._20_4_ = 0xbf800000;
                auVar172._24_4_ = 0xbf800000;
                auVar172._28_4_ = 0xbf800000;
                auVar41._8_4_ = 0x40000000;
                auVar41._0_8_ = 0x4000000040000000;
                auVar41._12_4_ = 0x40000000;
                auVar41._16_4_ = 0x40000000;
                auVar41._20_4_ = 0x40000000;
                auVar41._24_4_ = 0x40000000;
                auVar41._28_4_ = 0x40000000;
                local_480 = vfmadd132ps_avx512vl(local_320,auVar172,auVar41);
                local_320 = local_480;
                auVar115 = local_320;
                local_440 = (undefined4)lVar100;
                local_430 = local_780;
                uStack_428 = uStack_778;
                local_420 = local_700._0_8_;
                uStack_418 = local_700._8_8_;
                local_410 = local_710._0_8_;
                uStack_408 = local_710._8_8_;
                local_400 = local_6f0;
                uStack_3f8 = uStack_6e8;
                pGVar17 = (context->scene->geometries).items[uVar101].ptr;
                local_320 = auVar115;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar106 = vcvtsi2ss_avx512f(auVar233._0_16_,local_440);
                  fVar194 = auVar106._0_4_;
                  local_3e0[0] = (fVar194 + local_6c0._0_4_ + 0.0) * local_340;
                  local_3e0[1] = (fVar194 + local_6c0._4_4_ + 1.0) * fStack_33c;
                  local_3e0[2] = (fVar194 + local_6c0._8_4_ + 2.0) * fStack_338;
                  local_3e0[3] = (fVar194 + local_6c0._12_4_ + 3.0) * fStack_334;
                  fStack_3d0 = (fVar194 + local_6c0._16_4_ + 4.0) * fStack_330;
                  fStack_3cc = (fVar194 + local_6c0._20_4_ + 5.0) * fStack_32c;
                  fStack_3c8 = (fVar194 + local_6c0._24_4_ + 6.0) * fStack_328;
                  fStack_3c4 = fVar194 + local_6c0._28_4_ + 7.0;
                  local_320._0_8_ = local_480._0_8_;
                  local_320._8_8_ = local_480._8_8_;
                  local_320._16_8_ = local_480._16_8_;
                  local_320._24_8_ = local_480._24_8_;
                  local_3c0 = local_320._0_8_;
                  uStack_3b8 = local_320._8_8_;
                  uStack_3b0 = local_320._16_8_;
                  uStack_3a8 = local_320._24_8_;
                  local_3a0 = local_6e0;
                  auVar173._8_4_ = 0x7f800000;
                  auVar173._0_8_ = 0x7f8000007f800000;
                  auVar173._12_4_ = 0x7f800000;
                  auVar173._16_4_ = 0x7f800000;
                  auVar173._20_4_ = 0x7f800000;
                  auVar173._24_4_ = 0x7f800000;
                  auVar173._28_4_ = 0x7f800000;
                  auVar115 = vblendmps_avx512vl(auVar173,local_6e0);
                  auVar148._0_4_ =
                       (uint)(local_3f0 & 1) * auVar115._0_4_ |
                       (uint)!(bool)(local_3f0 & 1) * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 1 & 1);
                  auVar148._4_4_ = (uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 2 & 1);
                  auVar148._8_4_ = (uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 3 & 1);
                  auVar148._12_4_ = (uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 4 & 1);
                  auVar148._16_4_ = (uint)bVar22 * auVar115._16_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 5 & 1);
                  auVar148._20_4_ = (uint)bVar22 * auVar115._20_4_ | (uint)!bVar22 * 0x7f800000;
                  bVar22 = (bool)(local_3f0 >> 6 & 1);
                  auVar148._24_4_ = (uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * 0x7f800000;
                  auVar148._28_4_ =
                       (uint)(local_3f0 >> 7) * auVar115._28_4_ |
                       (uint)!(bool)(local_3f0 >> 7) * 0x7f800000;
                  auVar115 = vshufps_avx(auVar148,auVar148,0xb1);
                  auVar115 = vminps_avx(auVar148,auVar115);
                  auVar114 = vshufpd_avx(auVar115,auVar115,5);
                  auVar115 = vminps_avx(auVar115,auVar114);
                  auVar114 = vpermpd_avx2(auVar115,0x4e);
                  auVar115 = vminps_avx(auVar115,auVar114);
                  uVar163 = vcmpps_avx512vl(auVar148,auVar115,0);
                  bVar96 = (byte)uVar163 & local_3f0;
                  bVar103 = local_3f0;
                  if (bVar96 != 0) {
                    bVar103 = bVar96;
                  }
                  uVar31 = 0;
                  for (uVar98 = (uint)bVar103; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000)
                  {
                    uVar31 = uVar31 + 1;
                  }
                  uVar97 = (ulong)uVar31;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar194 = local_3e0[uVar97];
                    uVar162 = *(undefined4 *)((long)&local_3c0 + uVar97 * 4);
                    fVar201 = 1.0 - fVar194;
                    fVar161 = fVar201 * fVar201 * -3.0;
                    auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * fVar201)),
                                               ZEXT416((uint)(fVar194 * fVar201)),
                                               ZEXT416(0xc0000000));
                    auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar194 * fVar201)),
                                               ZEXT416((uint)(fVar194 * fVar194)),
                                               ZEXT416(0x40000000));
                    fVar201 = auVar106._0_4_ * 3.0;
                    fVar202 = auVar107._0_4_ * 3.0;
                    fVar186 = fVar194 * fVar194 * 3.0;
                    auVar204._0_4_ = fVar186 * (float)local_6f0._0_4_;
                    auVar204._4_4_ = fVar186 * (float)local_6f0._4_4_;
                    auVar204._8_4_ = fVar186 * (float)uStack_6e8;
                    auVar204._12_4_ = fVar186 * uStack_6e8._4_4_;
                    auVar182._4_4_ = fVar202;
                    auVar182._0_4_ = fVar202;
                    auVar182._8_4_ = fVar202;
                    auVar182._12_4_ = fVar202;
                    auVar106 = vfmadd132ps_fma(auVar182,auVar204,local_710);
                    auVar188._4_4_ = fVar201;
                    auVar188._0_4_ = fVar201;
                    auVar188._8_4_ = fVar201;
                    auVar188._12_4_ = fVar201;
                    auVar106 = vfmadd132ps_fma(auVar188,auVar106,local_700);
                    auVar183._4_4_ = fVar161;
                    auVar183._0_4_ = fVar161;
                    auVar183._8_4_ = fVar161;
                    auVar183._12_4_ = fVar161;
                    auVar106 = vfmadd132ps_fma(auVar183,auVar106,auVar7);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar97 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar106._0_4_;
                    uVar226 = vextractps_avx(auVar106,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar226;
                    uVar226 = vextractps_avx(auVar106,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar226;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar194;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar162;
                    *(uint *)(ray + k * 4 + 0x220) = uVar14;
                    *(uint *)(ray + k * 4 + 0x240) = uVar101;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_630 = local_700._0_4_;
                    fStack_62c = local_700._4_4_;
                    fStack_628 = local_700._8_4_;
                    fStack_624 = local_700._12_4_;
                    local_730 = local_710;
                    local_2d0 = local_6f0;
                    uStack_2c8 = uStack_6e8;
                    local_2c0 = vmovdqa64_avx512vl(auVar228._0_32_);
                    local_4a0 = local_6c0;
                    local_460 = local_6e0;
                    local_43c = iVar15;
                    bVar103 = local_3f0;
                    do {
                      auVar236 = auVar237._0_16_;
                      local_620 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_220 = local_3e0[uVar97];
                      local_200 = *(undefined4 *)((long)&local_3c0 + uVar97 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar97 * 4)
                      ;
                      local_768.context = context->user;
                      fVar161 = 1.0 - local_220;
                      fVar194 = fVar161 * fVar161 * -3.0;
                      auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar161 * fVar161)),
                                                 ZEXT416((uint)(local_220 * fVar161)),
                                                 ZEXT416(0xc0000000));
                      auVar107 = vfmsub132ss_fma(ZEXT416((uint)(local_220 * fVar161)),
                                                 ZEXT416((uint)(local_220 * local_220)),
                                                 ZEXT416(0x40000000));
                      fVar161 = auVar106._0_4_ * 3.0;
                      fVar201 = auVar107._0_4_ * 3.0;
                      fVar202 = local_220 * local_220 * 3.0;
                      auVar205._0_4_ = fVar202 * (float)local_2d0;
                      auVar205._4_4_ = fVar202 * local_2d0._4_4_;
                      auVar205._8_4_ = fVar202 * (float)uStack_2c8;
                      auVar205._12_4_ = fVar202 * uStack_2c8._4_4_;
                      auVar165._4_4_ = fVar201;
                      auVar165._0_4_ = fVar201;
                      auVar165._8_4_ = fVar201;
                      auVar165._12_4_ = fVar201;
                      auVar106 = vfmadd132ps_fma(auVar165,auVar205,local_730);
                      auVar189._4_4_ = fVar161;
                      auVar189._0_4_ = fVar161;
                      auVar189._8_4_ = fVar161;
                      auVar189._12_4_ = fVar161;
                      auVar91._4_4_ = fStack_62c;
                      auVar91._0_4_ = local_630;
                      auVar91._8_4_ = fStack_628;
                      auVar91._12_4_ = fStack_624;
                      auVar106 = vfmadd132ps_fma(auVar189,auVar106,auVar91);
                      auVar166._4_4_ = fVar194;
                      auVar166._0_4_ = fVar194;
                      auVar166._8_4_ = fVar194;
                      auVar166._12_4_ = fVar194;
                      auVar106 = vfmadd132ps_fma(auVar166,auVar106,auVar7);
                      local_280 = auVar106._0_4_;
                      auVar199._8_4_ = 1;
                      auVar199._0_8_ = 0x100000001;
                      auVar199._12_4_ = 1;
                      auVar199._16_4_ = 1;
                      auVar199._20_4_ = 1;
                      auVar199._24_4_ = 1;
                      auVar199._28_4_ = 1;
                      local_260 = vpermps_avx2(auVar199,ZEXT1632(auVar106));
                      auVar208._8_4_ = 2;
                      auVar208._0_8_ = 0x200000002;
                      auVar208._12_4_ = 2;
                      auVar208._16_4_ = 2;
                      auVar208._20_4_ = 2;
                      auVar208._24_4_ = 2;
                      auVar208._28_4_ = 2;
                      local_240 = vpermps_avx2(auVar208,ZEXT1632(auVar106));
                      iStack_27c = local_280;
                      iStack_278 = local_280;
                      iStack_274 = local_280;
                      iStack_270 = local_280;
                      iStack_26c = local_280;
                      iStack_268 = local_280;
                      iStack_264 = local_280;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_380._0_8_;
                      uStack_1d8 = local_380._8_8_;
                      uStack_1d0 = local_380._16_8_;
                      uStack_1c8 = local_380._24_8_;
                      local_1c0 = local_360;
                      auVar115 = vpcmpeqd_avx2(local_360,local_360);
                      local_738[1] = auVar115;
                      *local_738 = auVar115;
                      local_1a0 = (local_768.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_768.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_660 = local_2a0._0_8_;
                      uStack_658 = local_2a0._8_8_;
                      uStack_650 = local_2a0._16_8_;
                      uStack_648 = local_2a0._24_8_;
                      local_768.valid = (int *)&local_660;
                      local_768.geometryUserPtr = pGVar17->userPtr;
                      local_768.hit = (RTCHitN *)&local_280;
                      local_768.N = 8;
                      local_720 = (uint)bVar103;
                      local_768.ray = (RTCRayN *)ray;
                      if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar17->intersectionFilterN)(&local_768);
                        auVar115 = vmovdqa64_avx512vl(local_2c0);
                        auVar228 = ZEXT3264(auVar115);
                        auVar243 = ZEXT3264(local_540);
                        auVar242 = ZEXT3264(local_520);
                        auVar241 = ZEXT3264(local_5c0);
                        auVar240 = ZEXT3264(local_5a0);
                        auVar239 = ZEXT3264(local_500);
                        auVar238 = ZEXT3264(local_580);
                        auVar234 = ZEXT3264(local_4e0);
                        auVar235 = ZEXT3264(local_560);
                        auVar106 = vxorps_avx512vl(auVar236,auVar236);
                        auVar237 = ZEXT1664(auVar106);
                      }
                      bVar96 = (byte)local_720;
                      auVar106 = auVar237._0_16_;
                      auVar87._8_8_ = uStack_658;
                      auVar87._0_8_ = local_660;
                      auVar87._16_8_ = uStack_650;
                      auVar87._24_8_ = uStack_648;
                      if (auVar87 == (undefined1  [32])0x0) {
LAB_01eea771:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_620;
                      }
                      else {
                        p_Var21 = context->args->filter;
                        if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var21)(&local_768);
                          bVar96 = (byte)local_720;
                          auVar115 = vmovdqa64_avx512vl(local_2c0);
                          auVar228 = ZEXT3264(auVar115);
                          auVar243 = ZEXT3264(local_540);
                          auVar242 = ZEXT3264(local_520);
                          auVar241 = ZEXT3264(local_5c0);
                          auVar240 = ZEXT3264(local_5a0);
                          auVar239 = ZEXT3264(local_500);
                          auVar238 = ZEXT3264(local_580);
                          auVar234 = ZEXT3264(local_4e0);
                          auVar235 = ZEXT3264(local_560);
                          auVar106 = vxorps_avx512vl(auVar106,auVar106);
                          auVar237 = ZEXT1664(auVar106);
                        }
                        auVar88._8_8_ = uStack_658;
                        auVar88._0_8_ = local_660;
                        auVar88._16_8_ = uStack_650;
                        auVar88._24_8_ = uStack_648;
                        if (auVar88 == (undefined1  [32])0x0) goto LAB_01eea771;
                        uVar30 = vptestmd_avx512vl(auVar88,auVar88);
                        iVar1 = *(int *)(local_768.hit + 4);
                        iVar2 = *(int *)(local_768.hit + 8);
                        iVar81 = *(int *)(local_768.hit + 0xc);
                        iVar82 = *(int *)(local_768.hit + 0x10);
                        iVar83 = *(int *)(local_768.hit + 0x14);
                        iVar84 = *(int *)(local_768.hit + 0x18);
                        iVar85 = *(int *)(local_768.hit + 0x1c);
                        bVar103 = (byte)uVar30;
                        bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar28 = SUB81(uVar30 >> 7,0);
                        *(uint *)(local_768.ray + 0x180) =
                             (uint)(bVar103 & 1) * *(int *)local_768.hit |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_768.ray + 0x180);
                        *(uint *)(local_768.ray + 0x184) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x184);
                        *(uint *)(local_768.ray + 0x188) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x188);
                        *(uint *)(local_768.ray + 0x18c) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x18c)
                        ;
                        *(uint *)(local_768.ray + 400) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 400);
                        *(uint *)(local_768.ray + 0x194) =
                             (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x194)
                        ;
                        *(uint *)(local_768.ray + 0x198) =
                             (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x198)
                        ;
                        *(uint *)(local_768.ray + 0x19c) =
                             (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_768.hit + 0x24);
                        iVar2 = *(int *)(local_768.hit + 0x28);
                        iVar81 = *(int *)(local_768.hit + 0x2c);
                        iVar82 = *(int *)(local_768.hit + 0x30);
                        iVar83 = *(int *)(local_768.hit + 0x34);
                        iVar84 = *(int *)(local_768.hit + 0x38);
                        iVar85 = *(int *)(local_768.hit + 0x3c);
                        bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar28 = SUB81(uVar30 >> 7,0);
                        *(uint *)(local_768.ray + 0x1a0) =
                             (uint)(bVar103 & 1) * *(int *)(local_768.hit + 0x20) |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_768.ray + 0x1a0);
                        *(uint *)(local_768.ray + 0x1a4) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1a4);
                        *(uint *)(local_768.ray + 0x1a8) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1a8);
                        *(uint *)(local_768.ray + 0x1ac) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1ac)
                        ;
                        *(uint *)(local_768.ray + 0x1b0) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1b0)
                        ;
                        *(uint *)(local_768.ray + 0x1b4) =
                             (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x1b4)
                        ;
                        *(uint *)(local_768.ray + 0x1b8) =
                             (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1b8)
                        ;
                        *(uint *)(local_768.ray + 0x1bc) =
                             (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_768.hit + 0x44);
                        iVar2 = *(int *)(local_768.hit + 0x48);
                        iVar81 = *(int *)(local_768.hit + 0x4c);
                        iVar82 = *(int *)(local_768.hit + 0x50);
                        iVar83 = *(int *)(local_768.hit + 0x54);
                        iVar84 = *(int *)(local_768.hit + 0x58);
                        iVar85 = *(int *)(local_768.hit + 0x5c);
                        bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar28 = SUB81(uVar30 >> 7,0);
                        *(uint *)(local_768.ray + 0x1c0) =
                             (uint)(bVar103 & 1) * *(int *)(local_768.hit + 0x40) |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_768.ray + 0x1c0);
                        *(uint *)(local_768.ray + 0x1c4) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1c4);
                        *(uint *)(local_768.ray + 0x1c8) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1c8);
                        *(uint *)(local_768.ray + 0x1cc) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1cc)
                        ;
                        *(uint *)(local_768.ray + 0x1d0) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1d0)
                        ;
                        *(uint *)(local_768.ray + 0x1d4) =
                             (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 0x1d4)
                        ;
                        *(uint *)(local_768.ray + 0x1d8) =
                             (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1d8)
                        ;
                        *(uint *)(local_768.ray + 0x1dc) =
                             (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_768.hit + 100);
                        iVar2 = *(int *)(local_768.hit + 0x68);
                        iVar81 = *(int *)(local_768.hit + 0x6c);
                        iVar82 = *(int *)(local_768.hit + 0x70);
                        iVar83 = *(int *)(local_768.hit + 0x74);
                        iVar84 = *(int *)(local_768.hit + 0x78);
                        iVar85 = *(int *)(local_768.hit + 0x7c);
                        bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
                        bVar24 = (bool)((byte)(uVar30 >> 3) & 1);
                        bVar25 = (bool)((byte)(uVar30 >> 4) & 1);
                        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
                        bVar27 = (bool)((byte)(uVar30 >> 6) & 1);
                        bVar28 = SUB81(uVar30 >> 7,0);
                        *(uint *)(local_768.ray + 0x1e0) =
                             (uint)(bVar103 & 1) * *(int *)(local_768.hit + 0x60) |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_768.ray + 0x1e0);
                        *(uint *)(local_768.ray + 0x1e4) =
                             (uint)bVar22 * iVar1 | (uint)!bVar22 * *(int *)(local_768.ray + 0x1e4);
                        *(uint *)(local_768.ray + 0x1e8) =
                             (uint)bVar23 * iVar2 | (uint)!bVar23 * *(int *)(local_768.ray + 0x1e8);
                        *(uint *)(local_768.ray + 0x1ec) =
                             (uint)bVar24 * iVar81 | (uint)!bVar24 * *(int *)(local_768.ray + 0x1ec)
                        ;
                        *(uint *)(local_768.ray + 0x1f0) =
                             (uint)bVar25 * iVar82 | (uint)!bVar25 * *(int *)(local_768.ray + 0x1f0)
                        ;
                        *(uint *)(local_768.ray + 500) =
                             (uint)bVar26 * iVar83 | (uint)!bVar26 * *(int *)(local_768.ray + 500);
                        *(uint *)(local_768.ray + 0x1f8) =
                             (uint)bVar27 * iVar84 | (uint)!bVar27 * *(int *)(local_768.ray + 0x1f8)
                        ;
                        *(uint *)(local_768.ray + 0x1fc) =
                             (uint)bVar28 * iVar85 | (uint)!bVar28 * *(int *)(local_768.ray + 0x1fc)
                        ;
                        auVar149._0_4_ =
                             (uint)(bVar103 & 1) * *(int *)(local_768.hit + 0x80) |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_768.ray + 0x200);
                        bVar22 = (bool)((byte)(uVar30 >> 1) & 1);
                        auVar149._4_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x84) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x204);
                        bVar22 = (bool)((byte)(uVar30 >> 2) & 1);
                        auVar149._8_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x88) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x208);
                        bVar22 = (bool)((byte)(uVar30 >> 3) & 1);
                        auVar149._12_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x8c) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x20c);
                        bVar22 = (bool)((byte)(uVar30 >> 4) & 1);
                        auVar149._16_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x90) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x210);
                        bVar22 = (bool)((byte)(uVar30 >> 5) & 1);
                        auVar149._20_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x94) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x214);
                        bVar22 = (bool)((byte)(uVar30 >> 6) & 1);
                        auVar149._24_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x98) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x218);
                        bVar22 = SUB81(uVar30 >> 7,0);
                        auVar149._28_4_ =
                             (uint)bVar22 * *(int *)(local_768.hit + 0x9c) |
                             (uint)!bVar22 * *(int *)(local_768.ray + 0x21c);
                        *(undefined1 (*) [32])(local_768.ray + 0x200) = auVar149;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xa0));
                        *(undefined1 (*) [32])(local_768.ray + 0x220) = auVar115;
                        auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xc0));
                        *(undefined1 (*) [32])(local_768.ray + 0x240) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0xe0));
                        *(undefined1 (*) [32])(local_768.ray + 0x260) = auVar115;
                        auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_768.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_768.ray + 0x280) = auVar115;
                      }
                      bVar96 = ~(byte)(1 << ((uint)uVar97 & 0x1f)) & bVar96;
                      uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar42._4_4_ = uVar162;
                      auVar42._0_4_ = uVar162;
                      auVar42._8_4_ = uVar162;
                      auVar42._12_4_ = uVar162;
                      auVar42._16_4_ = uVar162;
                      auVar42._20_4_ = uVar162;
                      auVar42._24_4_ = uVar162;
                      auVar42._28_4_ = uVar162;
                      uVar163 = vcmpps_avx512vl(local_6e0,auVar42,2);
                      bVar103 = bVar96 & (byte)uVar163;
                      if ((bVar96 & (byte)uVar163) != 0) {
                        auVar174._8_4_ = 0x7f800000;
                        auVar174._0_8_ = 0x7f8000007f800000;
                        auVar174._12_4_ = 0x7f800000;
                        auVar174._16_4_ = 0x7f800000;
                        auVar174._20_4_ = 0x7f800000;
                        auVar174._24_4_ = 0x7f800000;
                        auVar174._28_4_ = 0x7f800000;
                        auVar115 = vblendmps_avx512vl(auVar174,local_6e0);
                        auVar150._0_4_ =
                             (uint)(bVar103 & 1) * auVar115._0_4_ |
                             (uint)!(bool)(bVar103 & 1) * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 1 & 1);
                        auVar150._4_4_ = (uint)bVar22 * auVar115._4_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 2 & 1);
                        auVar150._8_4_ = (uint)bVar22 * auVar115._8_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 3 & 1);
                        auVar150._12_4_ =
                             (uint)bVar22 * auVar115._12_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 4 & 1);
                        auVar150._16_4_ =
                             (uint)bVar22 * auVar115._16_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 5 & 1);
                        auVar150._20_4_ =
                             (uint)bVar22 * auVar115._20_4_ | (uint)!bVar22 * 0x7f800000;
                        bVar22 = (bool)(bVar103 >> 6 & 1);
                        auVar150._24_4_ =
                             (uint)bVar22 * auVar115._24_4_ | (uint)!bVar22 * 0x7f800000;
                        auVar150._28_4_ =
                             (uint)(bVar103 >> 7) * auVar115._28_4_ |
                             (uint)!(bool)(bVar103 >> 7) * 0x7f800000;
                        auVar115 = vshufps_avx(auVar150,auVar150,0xb1);
                        auVar115 = vminps_avx(auVar150,auVar115);
                        auVar114 = vshufpd_avx(auVar115,auVar115,5);
                        auVar115 = vminps_avx(auVar115,auVar114);
                        auVar114 = vpermpd_avx2(auVar115,0x4e);
                        auVar115 = vminps_avx(auVar115,auVar114);
                        uVar163 = vcmpps_avx512vl(auVar150,auVar115,0);
                        bVar95 = (byte)uVar163 & bVar103;
                        bVar96 = bVar103;
                        if (bVar95 != 0) {
                          bVar96 = bVar95;
                        }
                        uVar31 = 0;
                        for (uVar98 = (uint)bVar96; (uVar98 & 1) == 0;
                            uVar98 = uVar98 >> 1 | 0x80000000) {
                          uVar31 = uVar31 + 1;
                        }
                        uVar97 = (ulong)uVar31;
                      }
                    } while (bVar103 != 0);
                  }
                }
              }
            }
          }
          lVar100 = lVar100 + 8;
          auVar233 = auVar234;
        } while ((int)lVar100 < iVar15);
      }
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar162;
      auVar37._0_4_ = uVar162;
      auVar37._8_4_ = uVar162;
      auVar37._12_4_ = uVar162;
      auVar37._16_4_ = uVar162;
      auVar37._20_4_ = uVar162;
      auVar37._24_4_ = uVar162;
      auVar37._28_4_ = uVar162;
      uVar163 = vcmpps_avx512vl(local_80,auVar37,2);
      uVar101 = (uint)uVar99 & (uint)uVar99 + 0xff & (uint)uVar163;
      uVar99 = (ulong)uVar101;
    } while (uVar101 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }